

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O1

int av1_choose_var_based_partitioning
              (AV1_COMP *cpi,TileInfo *tile,ThreadData_conflict *td,MACROBLOCK *x,int mi_row,
              int mi_col)

{
  ulong uVar1;
  MACROBLOCKD *xd_00;
  undefined8 *puVar2;
  long lVar3;
  BLOCK_SIZE BVar4;
  uint8_t uVar5;
  byte bVar6;
  BLOCK_SIZE BVar7;
  ushort uVar8;
  ushort uVar9;
  aom_tune_content aVar10;
  SOURCE_SAD SVar11;
  SequenceHeader *pSVar12;
  MB_MODE_INFO *pMVar13;
  MB_MODE_INFO *pMVar14;
  MB_MODE_INFO *pMVar15;
  bool bVar16;
  bool bVar17;
  int64_t threshold;
  int64_t threshold_00;
  int64_t threshold_01;
  byte bVar18;
  PART_EVAL_STATUS PVar19;
  int lvl3_idx;
  uint uVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  NOISE_LEVEL NVar25;
  int iVar26;
  long lVar27;
  YV12_BUFFER_CONFIG *pYVar28;
  RefCntBuffer *pRVar29;
  YV12_BUFFER_CONFIG *pYVar30;
  int *piVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  int *piVar36;
  sbyte sVar37;
  byte bVar38;
  int iVar39;
  uint uVar40;
  int iVar41;
  int iVar42;
  undefined4 *puVar43;
  int16_t iVar44;
  ushort uVar45;
  int iVar46;
  int iVar47;
  long lVar48;
  uint uVar49;
  uint64_t blk_sad;
  YV12_BUFFER_CONFIG *pYVar50;
  buf_2d *pbVar51;
  undefined4 *puVar52;
  long lVar53;
  BLOCK_SIZE bsize;
  uint uVar54;
  MV MVar55;
  int iVar56;
  scale_factors *psVar57;
  long lVar58;
  int iVar59;
  long lVar60;
  uint8_t *puVar61;
  int iVar62;
  int iVar63;
  uint uVar64;
  uint8_t *puVar65;
  long lVar66;
  uint8_t *puVar67;
  uint uVar68;
  long lVar69;
  int *piVar70;
  uint uVar71;
  VP8x8 *vt_1;
  long lVar72;
  int lvl2_idx_3;
  long lVar73;
  int lvl2_idx;
  long lVar74;
  uint uVar75;
  uint uVar76;
  VP16x16 *vt_2;
  int lvl2_idx_1;
  int iVar77;
  _Bool _Var78;
  bool bVar79;
  bool bVar80;
  bool bVar81;
  int iVar82;
  uint uVar83;
  ulong uVar84;
  int iVar86;
  int iVar87;
  int iVar89;
  undefined1 auVar85 [16];
  ulong uVar88;
  ulong uVar90;
  ulong uVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  ulong uVar95;
  int iVar96;
  ulong uVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  uint8_t *local_338;
  VP128x128 *vt_5;
  YV12_BUFFER_CONFIG *local_308;
  uint8_t *local_2f8;
  uint local_2e8;
  long local_2d0;
  MACROBLOCKD *xd;
  uint sse [4];
  short local_288;
  uint uv_sad [2];
  int64_t local_248;
  int64_t iStack_240;
  int64_t local_238;
  int64_t iStack_230;
  int64_t local_228;
  int max_var_32x32 [4];
  ulong local_208;
  short local_200;
  int min_var_32x32 [4];
  PART_EVAL_STATUS local_1b8;
  PART_EVAL_STATUS local_1b7 [4];
  PART_EVAL_STATUS local_1b3 [16];
  PART_EVAL_STATUS aPStack_1a3 [67];
  long local_160;
  int *local_158;
  int *local_150;
  int *local_148;
  long local_140;
  long local_138;
  int *local_130;
  int *local_128;
  int *local_120;
  scale_factors sf_no_scale;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  int avg_16x16 [4] [4];
  int minvar_16x16 [4] [4];
  int maxvar_16x16 [4] [4];
  AV1_PRIMARY *pAVar31;
  
  iVar62 = (cpi->common).width;
  iVar77 = (cpi->common).height;
  av1_setup_scale_factors_for_frame(&sf_no_scale,iVar62,iVar77,iVar62,iVar77);
  if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
    bVar81 = true;
  }
  else if (cpi->ppi->use_svc == 0) {
    bVar81 = false;
  }
  else {
    bVar81 = (cpi->svc).layer_context[(cpi->svc).temporal_layer_id].is_key_frame != 0;
  }
  pSVar12 = (cpi->common).seq_params;
  BVar4 = pSVar12->sb_size;
  bsize = (BVar4 != BLOCK_64X64) * '\x03' + BLOCK_64X64;
  if ((((cpi->sf).rt_sf.skip_encoding_non_reference_slide_change != 0) &&
      ((cpi->rc).high_source_sad != 0)) && ((cpi->ppi->rtc_ref).non_reference_frame != 0)) {
    av1_set_fixed_partitioning
              (cpi,tile,(cpi->common).mi_params.mi_grid_base +
                        ((cpi->common).mi_params.mi_stride * mi_row + mi_col),mi_row,mi_col,bsize);
    x->force_zeromv_skip_for_sb = 1;
    return 0;
  }
  local_248 = (cpi->vbp_info).thresholds[0];
  iStack_240 = (cpi->vbp_info).thresholds[1];
  local_238 = (cpi->vbp_info).thresholds[2];
  iStack_230 = (cpi->vbp_info).thresholds[3];
  local_228 = (cpi->vbp_info).thresholds[4];
  if ((cpi->src_sad_blk_64x64 == (uint64_t *)0x0) ||
     ((cpi->svc).spatial_layer_id != (cpi->svc).number_spatial_layers + -1)) {
    blk_sad = 0;
  }
  else {
    iVar62 = pSVar12->mib_size >> (BVar4 == BLOCK_128X128);
    blk_sad = cpi->src_sad_blk_64x64
              [(mi_row / iVar62) * (((cpi->common).mi_params.mi_cols + iVar62 + -1) / iVar62) +
               mi_col / iVar62];
  }
  uVar54 = *(ushort *)&(*(x->e_mbd).mi)->field_0xa7 & 7;
  if (((cpi->oxcf).q_cfg.aq_mode == '\x03') && ((cpi->common).seg.enabled != '\0')) {
    _Var78 = uVar54 - 1 < 2;
  }
  else {
    _Var78 = false;
  }
  if (_Var78 == false) {
    iVar62 = (cpi->common).quant_params.base_qindex;
  }
  else {
    iVar62 = av1_get_qindex(&(cpi->common).seg,uVar54,(cpi->common).quant_params.base_qindex);
  }
  set_vbp_thresholds(cpi,&local_248,blk_sad,iVar62,(x->content_state_sb).low_sumdiff,
                     (x->content_state_sb).source_sad_nonrd,(x->content_state_sb).source_sad_rd,
                     _Var78,(x->content_state_sb).lighting_change);
  puVar61 = x->plane[0].src.buf;
  iVar62 = x->plane[0].src.stride;
  local_1b8 = '\0';
  (x->part_search_info).variance_low[0x59] = '\0';
  (x->part_search_info).variance_low[0x5a] = '\0';
  (x->part_search_info).variance_low[0x5b] = '\0';
  (x->part_search_info).variance_low[0x5c] = '\0';
  (x->part_search_info).variance_low[0x5d] = '\0';
  (x->part_search_info).variance_low[0x5e] = '\0';
  (x->part_search_info).variance_low[0x5f] = '\0';
  (x->part_search_info).variance_low[0x60] = '\0';
  (x->part_search_info).variance_low[0x61] = '\0';
  (x->part_search_info).variance_low[0x62] = '\0';
  (x->part_search_info).variance_low[99] = '\0';
  (x->part_search_info).variance_low[100] = '\0';
  (x->part_search_info).variance_low[0x65] = '\0';
  (x->part_search_info).variance_low[0x66] = '\0';
  (x->part_search_info).variance_low[0x67] = '\0';
  (x->part_search_info).variance_low[0x68] = '\0';
  (x->part_search_info).variance_low[0x50] = '\0';
  (x->part_search_info).variance_low[0x51] = '\0';
  (x->part_search_info).variance_low[0x52] = '\0';
  (x->part_search_info).variance_low[0x53] = '\0';
  (x->part_search_info).variance_low[0x54] = '\0';
  (x->part_search_info).variance_low[0x55] = '\0';
  (x->part_search_info).variance_low[0x56] = '\0';
  (x->part_search_info).variance_low[0x57] = '\0';
  (x->part_search_info).variance_low[0x58] = '\0';
  (x->part_search_info).variance_low[0x59] = '\0';
  (x->part_search_info).variance_low[0x5a] = '\0';
  (x->part_search_info).variance_low[0x5b] = '\0';
  (x->part_search_info).variance_low[0x5c] = '\0';
  (x->part_search_info).variance_low[0x5d] = '\0';
  (x->part_search_info).variance_low[0x5e] = '\0';
  (x->part_search_info).variance_low[0x5f] = '\0';
  (x->part_search_info).variance_low[0x40] = '\0';
  (x->part_search_info).variance_low[0x41] = '\0';
  (x->part_search_info).variance_low[0x42] = '\0';
  (x->part_search_info).variance_low[0x43] = '\0';
  (x->part_search_info).variance_low[0x44] = '\0';
  (x->part_search_info).variance_low[0x45] = '\0';
  (x->part_search_info).variance_low[0x46] = '\0';
  (x->part_search_info).variance_low[0x47] = '\0';
  (x->part_search_info).variance_low[0x48] = '\0';
  (x->part_search_info).variance_low[0x49] = '\0';
  (x->part_search_info).variance_low[0x4a] = '\0';
  (x->part_search_info).variance_low[0x4b] = '\0';
  (x->part_search_info).variance_low[0x4c] = '\0';
  (x->part_search_info).variance_low[0x4d] = '\0';
  (x->part_search_info).variance_low[0x4e] = '\0';
  (x->part_search_info).variance_low[0x4f] = '\0';
  (x->part_search_info).variance_low[0x30] = '\0';
  (x->part_search_info).variance_low[0x31] = '\0';
  (x->part_search_info).variance_low[0x32] = '\0';
  (x->part_search_info).variance_low[0x33] = '\0';
  (x->part_search_info).variance_low[0x34] = '\0';
  (x->part_search_info).variance_low[0x35] = '\0';
  (x->part_search_info).variance_low[0x36] = '\0';
  (x->part_search_info).variance_low[0x37] = '\0';
  (x->part_search_info).variance_low[0x38] = '\0';
  (x->part_search_info).variance_low[0x39] = '\0';
  (x->part_search_info).variance_low[0x3a] = '\0';
  (x->part_search_info).variance_low[0x3b] = '\0';
  (x->part_search_info).variance_low[0x3c] = '\0';
  (x->part_search_info).variance_low[0x3d] = '\0';
  (x->part_search_info).variance_low[0x3e] = '\0';
  (x->part_search_info).variance_low[0x3f] = '\0';
  (x->part_search_info).variance_low[0x20] = '\0';
  (x->part_search_info).variance_low[0x21] = '\0';
  (x->part_search_info).variance_low[0x22] = '\0';
  (x->part_search_info).variance_low[0x23] = '\0';
  (x->part_search_info).variance_low[0x24] = '\0';
  (x->part_search_info).variance_low[0x25] = '\0';
  (x->part_search_info).variance_low[0x26] = '\0';
  (x->part_search_info).variance_low[0x27] = '\0';
  (x->part_search_info).variance_low[0x28] = '\0';
  (x->part_search_info).variance_low[0x29] = '\0';
  (x->part_search_info).variance_low[0x2a] = '\0';
  (x->part_search_info).variance_low[0x2b] = '\0';
  (x->part_search_info).variance_low[0x2c] = '\0';
  (x->part_search_info).variance_low[0x2d] = '\0';
  (x->part_search_info).variance_low[0x2e] = '\0';
  (x->part_search_info).variance_low[0x2f] = '\0';
  (x->part_search_info).variance_low[0x10] = '\0';
  (x->part_search_info).variance_low[0x11] = '\0';
  (x->part_search_info).variance_low[0x12] = '\0';
  (x->part_search_info).variance_low[0x13] = '\0';
  (x->part_search_info).variance_low[0x14] = '\0';
  (x->part_search_info).variance_low[0x15] = '\0';
  (x->part_search_info).variance_low[0x16] = '\0';
  (x->part_search_info).variance_low[0x17] = '\0';
  (x->part_search_info).variance_low[0x18] = '\0';
  (x->part_search_info).variance_low[0x19] = '\0';
  (x->part_search_info).variance_low[0x1a] = '\0';
  (x->part_search_info).variance_low[0x1b] = '\0';
  (x->part_search_info).variance_low[0x1c] = '\0';
  (x->part_search_info).variance_low[0x1d] = '\0';
  (x->part_search_info).variance_low[0x1e] = '\0';
  (x->part_search_info).variance_low[0x1f] = '\0';
  (x->part_search_info).variance_low[0] = '\0';
  (x->part_search_info).variance_low[1] = '\0';
  (x->part_search_info).variance_low[2] = '\0';
  (x->part_search_info).variance_low[3] = '\0';
  (x->part_search_info).variance_low[4] = '\0';
  (x->part_search_info).variance_low[5] = '\0';
  (x->part_search_info).variance_low[6] = '\0';
  (x->part_search_info).variance_low[7] = '\0';
  (x->part_search_info).variance_low[8] = '\0';
  (x->part_search_info).variance_low[9] = '\0';
  (x->part_search_info).variance_low[10] = '\0';
  (x->part_search_info).variance_low[0xb] = '\0';
  (x->part_search_info).variance_low[0xc] = '\0';
  (x->part_search_info).variance_low[0xd] = '\0';
  (x->part_search_info).variance_low[0xe] = '\0';
  (x->part_search_info).variance_low[0xf] = '\0';
  if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
LAB_0024b736:
    bVar79 = false;
  }
  else {
    lVar27 = (long)(cpi->common).remapped_ref_idx[0];
    if (lVar27 == -1) {
      pRVar29 = (RefCntBuffer *)0x0;
    }
    else {
      pRVar29 = (cpi->common).ref_frame_map[lVar27];
    }
    if (pRVar29 == (RefCntBuffer *)0x0) {
      bVar79 = false;
      bVar81 = true;
    }
    else {
      if (((pRVar29->buf).field_3.field_0.y_crop_height == (cpi->common).height) &&
         ((pRVar29->buf).field_2.field_0.y_crop_width == (cpi->common).width)) goto LAB_0024b736;
      pYVar28 = av1_get_scaled_ref_frame(cpi,1);
      if (pYVar28 == (YV12_BUFFER_CONFIG *)0x0) {
        bVar81 = true;
      }
      bVar79 = true;
    }
  }
  xd_00 = &x->e_mbd;
  x->source_variance = 0xffffffff;
  if (((cpi->sf).rt_sf.use_nonrd_pick_mode != 0) &&
     (kLowSad < (x->content_state_sb).source_sad_nonrd)) {
    uVar20 = av1_get_perpixel_variance_facade
                       (cpi,xd_00,&x->plane[0].src,((cpi->common).seq_params)->sb_size,0);
    x->source_variance = uVar20;
  }
  if (bVar81 == false) {
    uVar5 = ((cpi->common).seq_params)->monochrome;
    pMVar14 = *(x->e_mbd).mi;
    if (bVar79) {
      pYVar28 = av1_get_scaled_ref_frame(cpi,1);
    }
    else {
      lVar27 = (long)(cpi->common).remapped_ref_idx[0];
      if (lVar27 == -1) {
        pRVar29 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar29 = (cpi->common).ref_frame_map[lVar27];
      }
      pYVar28 = &pRVar29->buf;
      if (pRVar29 == (RefCntBuffer *)0x0) {
        pYVar28 = (YV12_BUFFER_CONFIG *)0x0;
      }
    }
    bVar80 = true;
    bVar16 = true;
    if ((cpi->ref_frame_flags & 1U) == 0) {
      bVar16 = 1 < (cpi->svc).number_spatial_layers;
    }
    if (((cpi->ppi->rtc_ref).set_ref_frame_config == 0) &&
       ((cpi->sf).rt_sf.use_nonrd_altref_frame == 0)) {
      if ((cpi->sf).rt_sf.use_comp_ref_nonrd == 0) {
        bVar80 = false;
      }
      else {
        bVar80 = (cpi->sf).rt_sf.ref_frame_comp_nonrd[2] == 1;
      }
    }
    iVar77 = (uint)(uVar5 == '\0') * 2;
    iVar41 = iVar77 + 1;
    pYVar30 = (YV12_BUFFER_CONFIG *)0x0;
    if ((cpi->ref_frame_flags & 8U) == 0) goto LAB_0024b9a5;
    uVar20 = 0xffffffff;
    if ((cpi->svc).number_spatial_layers == 1) {
      if ((bool)((x->content_state_sb).source_sad_nonrd == kZeroSad & bVar16)) {
        pYVar30 = (YV12_BUFFER_CONFIG *)0x0;
      }
      else {
        lVar27 = (long)(cpi->common).remapped_ref_idx[3];
        if (lVar27 == -1) {
          pRVar29 = (RefCntBuffer *)0x0;
        }
        else {
          pRVar29 = (cpi->common).ref_frame_map[lVar27];
        }
        pYVar30 = &pRVar29->buf;
        if (pRVar29 == (RefCntBuffer *)0x0) {
          pYVar30 = (YV12_BUFFER_CONFIG *)0x0;
LAB_0024b982:
          bVar17 = false;
        }
        else {
          if (((pRVar29->buf).field_3.field_0.y_crop_height == (cpi->common).height) &&
             ((pRVar29->buf).field_2.field_0.y_crop_width == (cpi->common).width))
          goto LAB_0024b982;
          pYVar30 = av1_get_scaled_ref_frame(cpi,4);
          bVar17 = true;
        }
        if (pYVar30 == (YV12_BUFFER_CONFIG *)0x0) {
          pYVar30 = (YV12_BUFFER_CONFIG *)0x0;
        }
        else if (pYVar30 != pYVar28) {
          if (bVar17) {
            psVar57 = (scale_factors *)0x0;
          }
          else {
            lVar27 = (long)(cpi->common).remapped_ref_idx[3];
            psVar57 = (scale_factors *)0x0;
            if (lVar27 != -1) {
              psVar57 = (cpi->common).ref_scale_factors + lVar27;
            }
          }
          av1_setup_pre_planes(xd_00,0,pYVar30,mi_row,mi_col,psVar57,iVar41);
          uVar20 = (*cpi->ppi->fn_ptr[bsize].sdf)
                             (x->plane[0].src.buf,x->plane[0].src.stride,
                              (x->e_mbd).plane[0].pre[0].buf,(x->e_mbd).plane[0].pre[0].stride);
          goto LAB_0024b9ab;
        }
LAB_0024b9a5:
        uVar20 = 0xffffffff;
      }
    }
LAB_0024b9ab:
    if (((!(bool)((cpi->svc).number_spatial_layers == 1 & bVar80)) ||
        ((cpi->ref_frame_flags & 0x40) == 0)) ||
       ((bool)((x->content_state_sb).source_sad_nonrd == kZeroSad & bVar16))) {
LAB_0024bb12:
      uVar64 = 0xffffffff;
      local_308 = (YV12_BUFFER_CONFIG *)0x0;
    }
    else {
      lVar27 = (long)(cpi->common).remapped_ref_idx[6];
      if (lVar27 == -1) {
        pRVar29 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar29 = (cpi->common).ref_frame_map[lVar27];
      }
      local_308 = &pRVar29->buf;
      if (pRVar29 == (RefCntBuffer *)0x0) {
        local_308 = (YV12_BUFFER_CONFIG *)0x0;
LAB_0024baed:
        bVar80 = false;
      }
      else {
        if (((pRVar29->buf).field_3.field_0.y_crop_height == (cpi->common).height) &&
           ((pRVar29->buf).field_2.field_0.y_crop_width == (cpi->common).width)) goto LAB_0024baed;
        local_308 = av1_get_scaled_ref_frame(cpi,7);
        bVar80 = true;
      }
      uVar64 = 0xffffffff;
      if (local_308 == (YV12_BUFFER_CONFIG *)0x0) goto LAB_0024bb12;
      if (local_308 != pYVar28) {
        if (bVar80) {
          psVar57 = (scale_factors *)0x0;
        }
        else {
          lVar27 = (long)(cpi->common).remapped_ref_idx[6];
          psVar57 = (scale_factors *)0x0;
          if (lVar27 != -1) {
            psVar57 = (cpi->common).ref_scale_factors + lVar27;
          }
        }
        av1_setup_pre_planes(xd_00,0,local_308,mi_row,mi_col,psVar57,iVar41);
        uVar64 = (*cpi->ppi->fn_ptr[bsize].sdf)
                           (x->plane[0].src.buf,x->plane[0].src.stride,
                            (x->e_mbd).plane[0].pre[0].buf,(x->e_mbd).plane[0].pre[0].stride);
      }
    }
    uVar76 = 0xffffffff;
    if (bVar16) {
      SVar11 = (x->content_state_sb).source_sad_nonrd;
      if (bVar79) {
        psVar57 = (scale_factors *)0x0;
      }
      else {
        lVar27 = (long)(cpi->common).remapped_ref_idx[0];
        psVar57 = (scale_factors *)0x0;
        if (lVar27 != -1) {
          psVar57 = (cpi->common).ref_scale_factors + lVar27;
        }
      }
      av1_setup_pre_planes(xd_00,0,pYVar28,mi_row,mi_col,psVar57,iVar41);
      pMVar14->ref_frame[0] = '\x01';
      pMVar14->ref_frame[1] = -1;
      pMVar14->bsize = ((cpi->common).seq_params)->sb_size;
      pMVar14->mv[0].as_int = 0;
      (pMVar14->interp_filters).as_int = 0x30003;
      iVar59 = (cpi->sf).rt_sf.estimate_motion_for_var_based_partition;
      iVar63 = 2;
      if ((int)SVar11 < 4) {
        iVar63 = iVar59;
      }
      if (iVar59 < 3) {
        iVar63 = iVar59;
      }
      uVar76 = 0xffffffff;
      if (((iVar63 - 1U < 2) && (-1 < (x->e_mbd).mb_to_right_edge)) &&
         ((-1 < (x->e_mbd).mb_to_bottom_edge &&
          (uVar76 = 0xffffffff, 2 < (int)SVar11 && 100 < x->source_variance)))) {
        aVar10 = (cpi->oxcf).tune_cfg.content;
        uVar76 = 0x60;
        if ((3 < (int)SVar11) && ((cpi->rc).high_motion_content_screen_rtc == 0)) {
          if ((cpi->svc).temporal_layer_id == 0) {
            uVar76 = 0x200;
          }
          else {
            uVar76 = 0x60;
            if (2 < (cpi->rc).num_col_blscroll_last_tl0) {
              uVar76 = 0x200;
            }
          }
        }
        if (aVar10 != AOM_CONTENT_SCREEN) {
          uVar76 = (uint)(block_size_wide[((cpi->common).seq_params)->sb_size] >> 1);
        }
        if (aVar10 == AOM_CONTENT_SCREEN) {
          uVar75 = 0xc0;
          if (3 < (int)SVar11) {
            uVar75 = 0x200;
          }
        }
        else {
          uVar75 = (uint)(block_size_high[((cpi->common).seq_params)->sb_size] >> 1);
        }
        pMVar15 = *(x->e_mbd).mi;
        uVar76 = av1_int_pro_motion_estimation
                           (cpi,x,((cpi->common).seq_params)->sb_size,mi_row,mi_col,&kZeroMv,
                            (uint *)avg_16x16,uVar76,uVar75);
        if (aVar10 == AOM_CONTENT_SCREEN) {
          if (uVar76 < (uint)avg_16x16[0][0] >> 1) {
            uVar75 = 20000;
            if (((cpi->common).seq_params)->sb_size == BLOCK_128X128) {
              uVar75 = 50000;
            }
            if (uVar76 < uVar75) {
              x->sb_me_partition = 1;
              x->sb_me_mv = pMVar15->mv[0];
              if ((cpi->svc).temporal_layer_id == 0) {
                uVar8 = pMVar15->mv[0].as_mv.col;
                uVar9 = -uVar8;
                if (0 < (short)uVar8) {
                  uVar9 = uVar8;
                }
                if ((uVar9 < 0x11) || (pMVar15->mv[0].as_mv.row != 0)) {
                  uVar9 = pMVar15->mv[0].as_mv.row;
                  uVar45 = -uVar9;
                  if (0 < (short)uVar9) {
                    uVar45 = uVar9;
                  }
                  if ((uVar8 == 0) && (0x10 < uVar45)) {
                    x->sb_row_scroll = 1;
                  }
                }
                else {
                  x->sb_col_scroll = 1;
                }
              }
              goto LAB_0024be3c;
            }
          }
          x->sb_me_partition = 0;
          pMVar15->mv[0].as_int = 0;
          uVar76 = avg_16x16[0][0];
        }
      }
LAB_0024be3c:
      if (uVar76 == 0xffffffff) {
        uVar76 = (*cpi->ppi->fn_ptr[bsize].sdf)
                           (x->plane[0].src.buf,x->plane[0].src.stride,
                            (x->e_mbd).plane[0].pre[0].buf,(x->e_mbd).plane[0].pre[0].stride);
      }
      if ((1 < iVar63) &&
         (((_Var78 = (x->e_mbd).up_available, _Var78 != false || ((x->e_mbd).left_available == true)
           ) && (SVar11 = (x->content_state_sb).source_sad_nonrd, iVar63 == 2 || (int)SVar11 < 4))))
      {
        iVar59 = (x->mv_limits).col_min << 3;
        if (iVar59 < -0x1ff7) {
          iVar59 = -0x1ff8;
        }
        iVar47 = (x->mv_limits).col_max << 3;
        if (0x1ff7 < iVar47) {
          iVar47 = 0x1ff8;
        }
        iVar96 = (x->mv_limits).row_min << 3;
        if (iVar96 < -0x1ff7) {
          iVar96 = -0x1ff8;
        }
        iVar42 = (x->mv_limits).row_max << 3;
        if (0x1ff7 < iVar42) {
          iVar42 = 0x1ff8;
        }
        if (iVar47 < iVar59) {
          iVar47 = iVar59;
        }
        if (iVar42 < iVar96) {
          iVar42 = iVar96;
        }
        if (0x3ffe < iVar47) {
          iVar47 = 0x3fff;
        }
        if (0x3ffe < iVar42) {
          iVar42 = 0x3fff;
        }
        pMVar15 = *(x->e_mbd).mi;
        uVar24 = (uint)pMVar15->mv[0].as_mv.row;
        uVar22 = (uint)pMVar15->mv[0].as_mv.col;
        uVar40 = 0;
        uVar23 = 0;
        uVar75 = 0xffffffff;
        local_288 = (short)((uVar24 - ((int)~uVar24 >> 0x1f)) + 3 >> 3);
        vt_5._0_2_ = (short)((uVar22 - ((int)~uVar22 >> 0x1f)) + 3 >> 3);
        if (_Var78 != false) {
          pMVar13 = (x->e_mbd).above_mbmi;
          if ((pMVar13->mode < 0xd) || (pMVar13->ref_frame[0] != '\x01')) {
            uVar40 = 0;
            uVar23 = 0;
            uVar75 = 0xffffffff;
          }
          else {
            iVar56 = (int)pMVar13->mv[0].as_mv >> 0x10;
            iVar26 = iVar47;
            if (iVar56 < iVar47) {
              iVar26 = iVar56;
            }
            iVar21 = (int)pMVar13->mv[0].as_mv.row;
            if (iVar56 < iVar59) {
              iVar26 = iVar59;
            }
            iVar56 = iVar42;
            if (iVar21 < iVar42) {
              iVar56 = iVar21;
            }
            if (iVar21 < iVar96) {
              iVar56 = iVar96;
            }
            uVar75 = (int)(short)iVar56 + (uint)(-1 < (short)iVar56) + 3;
            uVar40 = uVar75 >> 3;
            uVar24 = (uint)(-1 < (short)iVar26) + (int)(short)iVar26 + 3;
            uVar23 = uVar24 >> 3;
            iVar56 = (int)uVar75 >> 3;
            iVar21 = local_288 - iVar56;
            iVar26 = -iVar21;
            if (0 < iVar21) {
              iVar26 = iVar21;
            }
            iVar46 = (int)uVar24 >> 3;
            iVar39 = (short)vt_5 - iVar46;
            iVar21 = -iVar39;
            if (0 < iVar39) {
              iVar21 = iVar39;
            }
            if (iVar21 == 0 && iVar26 == 0) {
              uVar75 = 0xffffffff;
            }
            else {
              iVar26 = (x->e_mbd).plane[0].pre[0].stride;
              uVar75 = (*cpi->ppi->fn_ptr[bsize].sdf)
                                 (x->plane[0].src.buf,x->plane[0].src.stride,
                                  (x->e_mbd).plane[0].pre[0].buf + (iVar56 * iVar26 + iVar46),iVar26
                                 );
            }
          }
        }
        uVar24 = 0;
        uVar22 = 0xffffffff;
        iVar63 = 8 - (uint)(2 < (int)SVar11 && iVar63 != 2);
        if (((x->e_mbd).left_available == true) &&
           (pMVar13 = (x->e_mbd).left_mbmi, 0xc < pMVar13->mode)) {
          if (pMVar13->ref_frame[0] == '\x01') {
            iVar56 = (int)pMVar13->mv[0].as_mv >> 0x10;
            iVar26 = iVar47;
            if (iVar56 < iVar47) {
              iVar26 = iVar56;
            }
            iVar21 = (int)pMVar13->mv[0].as_mv.row;
            if (iVar56 < iVar59) {
              iVar26 = iVar59;
            }
            iVar56 = iVar42;
            if (iVar21 < iVar42) {
              iVar56 = iVar21;
            }
            if (iVar21 < iVar96) {
              iVar56 = iVar96;
            }
            uVar22 = (int)(short)iVar56 + (uint)(-1 < (short)iVar56) + 3;
            uVar24 = uVar22 >> 3;
            uVar68 = (uint)(-1 < (short)iVar26) + (int)(short)iVar26 + 3;
            uVar49 = uVar68 >> 3;
            iVar56 = (int)uVar22 >> 3;
            iVar21 = local_288 - iVar56;
            iVar26 = -iVar21;
            if (0 < iVar21) {
              iVar26 = iVar21;
            }
            iVar46 = (int)uVar68 >> 3;
            iVar39 = (short)vt_5 - iVar46;
            iVar21 = -iVar39;
            if (0 < iVar39) {
              iVar21 = iVar39;
            }
            if (iVar21 != 0 || iVar26 != 0) {
              local_2e8._0_2_ = (short)uVar40;
              iVar21 = (short)local_2e8 - iVar56;
              iVar26 = -iVar21;
              if (0 < iVar21) {
                iVar26 = iVar21;
              }
              local_2f8._0_2_ = (short)uVar23;
              iVar39 = (short)local_2f8 - iVar46;
              iVar21 = -iVar39;
              if (0 < iVar39) {
                iVar21 = iVar39;
              }
              if (iVar21 != 0 || iVar26 != 0) {
                iVar26 = (x->e_mbd).plane[0].pre[0].stride;
                uVar22 = (*cpi->ppi->fn_ptr[bsize].sdf)
                                   (x->plane[0].src.buf,x->plane[0].src.stride,
                                    (x->e_mbd).plane[0].pre[0].buf + (iVar56 * iVar26 + iVar46),
                                    iVar26);
                goto LAB_0024c274;
              }
            }
            uVar22 = 0xffffffff;
          }
          else {
            uVar49 = 0;
            uVar24 = 0;
          }
        }
        else {
          uVar49 = 0;
        }
LAB_0024c274:
        if ((uVar75 < iVar63 * uVar76 >> 3) && (uVar75 < uVar22)) {
          MVar55 = (MV)(uVar23 * 0x80000 + (uVar40 & 0x1fff) * 8);
          pMVar15->mv[0].as_mv = MVar55;
          iVar56 = (int)pMVar15->mv[0].as_mv.col;
          iVar26 = iVar47;
          if (iVar56 < iVar47) {
            iVar26 = iVar56;
          }
          iVar44 = (int16_t)iVar26;
          if (iVar56 < iVar59) {
            iVar44 = (int16_t)iVar59;
          }
          pMVar15->mv[0].as_mv.col = iVar44;
          iVar56 = (int)MVar55.row;
          iVar26 = iVar42;
          if (iVar56 < iVar42) {
            iVar26 = iVar56;
          }
          iVar44 = (int16_t)iVar26;
          if (iVar56 < iVar96) {
            iVar44 = (int16_t)iVar96;
          }
          pMVar15->mv[0].as_mv.row = iVar44;
          uVar76 = uVar75;
        }
        if ((uVar22 < iVar63 * uVar76 >> 3) && (uVar22 < uVar75)) {
          MVar55 = (MV)(uVar49 * 0x80000 + (uVar24 & 0x1fff) * 8);
          pMVar15->mv[0].as_mv = MVar55;
          iVar63 = (int)pMVar15->mv[0].as_mv.col;
          if (iVar63 < iVar47) {
            iVar47 = iVar63;
          }
          iVar44 = (int16_t)iVar47;
          if (iVar63 < iVar59) {
            iVar44 = (int16_t)iVar59;
          }
          pMVar15->mv[0].as_mv.col = iVar44;
          iVar59 = (int)MVar55.row;
          if (iVar59 < iVar42) {
            iVar42 = iVar59;
          }
          iVar44 = (int16_t)iVar42;
          if (iVar59 < iVar96) {
            iVar44 = (int16_t)iVar96;
          }
          pMVar15->mv[0].as_mv.row = iVar44;
          uVar76 = uVar22;
        }
      }
    }
    if (((double)uVar76 * 0.9 <= (double)uVar20) || (uVar64 <= uVar20)) {
      if ((uVar20 <= uVar64) || ((double)uVar76 * 0.9 <= (double)uVar64)) {
        x->nonrd_prune_ref_frame_search = (cpi->sf).rt_sf.nonrd_prune_ref_frame_search;
        bVar16 = true;
        uVar75 = uVar76;
      }
      else {
        lVar27 = (long)(cpi->common).remapped_ref_idx[6];
        psVar57 = (scale_factors *)0x0;
        if (lVar27 != -1) {
          psVar57 = (cpi->common).ref_scale_factors + lVar27;
        }
        av1_setup_pre_planes(xd_00,0,local_308,mi_row,mi_col,psVar57,iVar41);
        pMVar14->ref_frame[0] = '\a';
        pMVar14->mv[0].as_int = 0;
        x->nonrd_prune_ref_frame_search = 0;
        bVar16 = false;
        x->sb_me_partition = 0;
        uVar75 = uVar64;
      }
    }
    else {
      lVar27 = (long)(cpi->common).remapped_ref_idx[3];
      psVar57 = (scale_factors *)0x0;
      if (lVar27 != -1) {
        psVar57 = (cpi->common).ref_scale_factors + lVar27;
      }
      av1_setup_pre_planes(xd_00,0,pYVar30,mi_row,mi_col,psVar57,iVar41);
      pMVar14->ref_frame[0] = '\x04';
      pMVar14->mv[0].as_int = 0;
      x->nonrd_prune_ref_frame_search = 0;
      bVar16 = false;
      x->sb_me_partition = 0;
      uVar75 = uVar20;
    }
    if (pMVar14->mv[0].as_int != 0) {
      if (bVar79) {
        (x->e_mbd).block_ref_scale_factors[0] = &sf_no_scale;
        psVar57 = &sf_no_scale;
      }
      else {
        bVar38 = pMVar14->ref_frame[0];
        bVar6 = pMVar14->ref_frame[1];
        iVar59 = -1;
        iVar41 = -1;
        if ((char)bVar38 < '\t') {
          bVar18 = 1;
          if ('\x01' < (char)bVar38) {
            bVar18 = bVar38;
          }
          iVar41 = (cpi->common).remapped_ref_idx[bVar18 - 1];
        }
        psVar57 = (scale_factors *)0x0;
        if (iVar41 != -1) {
          psVar57 = (cpi->common).ref_scale_factors + iVar41;
        }
        (x->e_mbd).block_ref_scale_factors[0] = psVar57;
        if ((char)bVar6 < '\t') {
          bVar38 = 1;
          if ('\x01' < (char)bVar6) {
            bVar38 = bVar6;
          }
          iVar59 = (cpi->common).remapped_ref_idx[bVar38 - 1];
        }
        psVar57 = (scale_factors *)0x0;
        if (iVar59 != -1) {
          psVar57 = (cpi->common).ref_scale_factors + iVar59;
        }
      }
      (x->e_mbd).block_ref_scale_factors[1] = psVar57;
      av1_enc_build_inter_predictor
                (&cpi->common,xd_00,mi_row,mi_col,(BUFFER_SET *)0x0,
                 ((cpi->common).seq_params)->sb_size,0,iVar77);
    }
    bVar79 = (*(x->e_mbd).mi)->mv[0].as_int == 0;
    local_2f8 = (x->e_mbd).plane[0].pre[(ulong)bVar79 - 1].buf;
    iVar77 = (x->e_mbd).plane[0].pre[(ulong)bVar79 - 1].stride;
  }
  else {
    iVar77 = 0;
    bVar16 = true;
    uVar75 = 0xffffffff;
    uVar20 = 0xffffffff;
    uVar64 = 0xffffffff;
    uVar76 = 0xffffffff;
    bVar79 = true;
    local_2f8 = (uint8_t *)0x0;
  }
  uv_sad[0] = 0;
  uv_sad[1] = 0;
  if ((bVar81 == false) && ((cpi->oxcf).tool_cfg.enable_monochrome == false)) {
    aVar10 = (cpi->oxcf).tune_cfg.content;
    uVar40 = 6;
    if (aVar10 != AOM_CONTENT_SCREEN) {
      uVar40 = (uint)((cpi->common).height * (cpi->common).width < 0x1fa400) * 2 + 3;
    }
    SVar11 = (x->content_state_sb).source_sad_nonrd;
    if (aVar10 == AOM_CONTENT_SCREEN) {
      if ((cpi->rc).high_source_sad == 0) {
        if (((cpi->rc).percent_blocks_with_motion < 0x5b) ||
           ((cpi->rc).frame_source_sad < 0x2711 || (int)SVar11 < 3)) goto LAB_0024c6e7;
        sVar37 = 3;
        bVar38 = 8;
      }
      else {
        sVar37 = 1;
        bVar38 = 7;
      }
    }
    else {
LAB_0024c6e7:
      sVar37 = 1;
      bVar38 = 3;
      if ((2 < (int)SVar11) &&
         ((500 < x->source_variance && (0x383ff < (cpi->common).height * (cpi->common).width)))) {
        bVar38 = SVar11 == kMedSad ^ 5;
        sVar37 = 2;
      }
    }
    iVar41 = (cpi->common).remapped_ref_idx[0];
    lVar27 = (long)iVar41;
    if (lVar27 == -1) {
      pRVar29 = (RefCntBuffer *)0x0;
    }
    else {
      pRVar29 = (cpi->common).ref_frame_map[lVar27];
    }
    pYVar28 = &pRVar29->buf;
    if (pRVar29 == (RefCntBuffer *)0x0) {
      pYVar28 = (YV12_BUFFER_CONFIG *)0x0;
    }
    lVar48 = (long)(cpi->common).remapped_ref_idx[3];
    if (lVar48 == -1) {
      pRVar29 = (RefCntBuffer *)0x0;
    }
    else {
      pRVar29 = (cpi->common).ref_frame_map[lVar48];
    }
    pYVar30 = &pRVar29->buf;
    if (pRVar29 == (RefCntBuffer *)0x0) {
      pYVar30 = (YV12_BUFFER_CONFIG *)0x0;
    }
    lVar48 = (long)(cpi->common).remapped_ref_idx[6];
    uVar23 = 0;
    if (lVar48 == -1) {
      pRVar29 = (RefCntBuffer *)0x0;
    }
    else {
      pRVar29 = (cpi->common).ref_frame_map[lVar48];
    }
    pYVar50 = &pRVar29->buf;
    if (pRVar29 == (RefCntBuffer *)0x0) {
      pYVar50 = (YV12_BUFFER_CONFIG *)0x0;
    }
    psVar57 = (cpi->common).ref_scale_factors + lVar27;
    if (iVar41 == -1) {
      psVar57 = (scale_factors *)0x0;
    }
    pMVar14 = *(x->e_mbd).mi;
    piVar32 = &(x->e_mbd).plane[1].subsampling_x;
    pbVar51 = &x->plane[1].src;
    lVar27 = 0;
    uVar24 = 0;
    do {
      iVar59 = *piVar32;
      iVar63 = piVar32[1];
      uVar84 = (ulong)av1_ss_size_lookup[bsize][iVar59][iVar63];
      if (uVar84 != 0xff) {
        if (bVar79) {
          if (pMVar14->ref_frame[0] == '\x01') {
            pAVar31 = cpi->ppi;
            puVar65 = pbVar51->buf;
            iVar59 = pbVar51->stride;
            puVar67 = ((buf_2d *)(piVar32 + 0xb))->buf;
            iVar63 = piVar32[0x11];
          }
          else {
            BVar7 = (*(x->e_mbd).mi)->bsize;
            uVar22 = (x->e_mbd).mi_row;
            uVar49 = (x->e_mbd).mi_col;
            uVar68 = (uint)(0x20005L >> (BVar7 & 0x3f)) & uVar22 & 1;
            if (iVar63 == 0) {
              uVar68 = 0;
            }
            uVar71 = (uint)(0x10003L >> (BVar7 & 0x3f)) & uVar49 & 1;
            if (iVar59 == 0) {
              uVar71 = 0;
            }
            iVar47 = (int)((uVar49 - uVar71) * 4) >> ((byte)iVar59 & 0x1f);
            iVar59 = (int)((uVar22 - uVar68) * 4) >> ((byte)iVar63 & 0x1f);
            if (iVar41 != -1) {
              iVar63 = psVar57->x_scale_fp;
              if ((long)iVar63 != -1) {
                iVar96 = psVar57->y_scale_fp;
                if (((long)iVar96 != -1) && (iVar96 != 0x4000 || iVar63 != 0x4000)) {
                  lVar48 = (long)(iVar63 * 8 + -0x20000) + (long)iVar47 * (long)iVar63;
                  if (lVar48 < 0) {
                    iVar47 = -(int)((ulong)(0x80 - lVar48) >> 8);
                  }
                  else {
                    iVar47 = (int)((ulong)(lVar48 + 0x80) >> 8);
                  }
                  lVar48 = (long)(iVar96 * 8 + -0x20000) + (long)iVar59 * (long)iVar96;
                  if (lVar48 < 0) {
                    iVar59 = -(int)((ulong)(0x80 - lVar48) >> 8);
                  }
                  else {
                    iVar59 = (int)((ulong)(lVar48 + 0x80) >> 8);
                  }
                  iVar47 = iVar47 >> 6;
                  iVar59 = iVar59 >> 6;
                }
              }
            }
            iVar63 = (pYVar28->field_4).field_0.uv_stride;
            puVar67 = pYVar28->store_buf_adr[(ulong)(lVar27 != 0) - 3] +
                      (long)iVar59 * (long)iVar63 + (long)iVar47;
            pAVar31 = cpi->ppi;
            puVar65 = pbVar51->buf;
            iVar59 = pbVar51->stride;
          }
        }
        else {
          pAVar31 = cpi->ppi;
          puVar65 = pbVar51->buf;
          iVar59 = pbVar51->stride;
          puVar67 = ((buf_2d *)(piVar32 + 3))->buf;
          iVar63 = piVar32[9];
        }
        uVar22 = (*pAVar31->fn_ptr[uVar84].sdf)(puVar65,iVar59,puVar67,iVar63);
        uv_sad[lVar27] = uVar22;
        if (uVar20 != 0xffffffff) {
          pMVar15 = *(x->e_mbd).mi;
          uVar23._0_1_ = pMVar15->bsize;
          uVar23._1_1_ = pMVar15->partition;
          uVar23._2_1_ = pMVar15->mode;
          uVar23._3_1_ = pMVar15->uv_mode;
          uVar22 = (uint)((0x20005UL >> ((ulong)uVar23 & 0x3f) & 1) != 0);
          if (piVar32[1] == 0) {
            uVar22 = 0;
          }
          uVar23 = (uint)((0x10003UL >> ((ulong)uVar23 & 0x3f) & 1) != 0);
          if (*piVar32 == 0) {
            uVar23 = 0;
          }
          iVar63 = (int)((~uVar23 & (x->e_mbd).mi_col) << 2) >> ((byte)*piVar32 & 0x1f);
          iVar59 = (int)((~uVar22 & (x->e_mbd).mi_row) << 2) >> ((byte)piVar32[1] & 0x1f);
          if (iVar41 != -1) {
            iVar47 = psVar57->x_scale_fp;
            if ((long)iVar47 != -1) {
              iVar96 = psVar57->y_scale_fp;
              if (((long)iVar96 != -1) && (iVar96 != 0x4000 || iVar47 != 0x4000)) {
                lVar48 = (long)(iVar47 * 8 + -0x20000) + (long)iVar63 * (long)iVar47;
                if (lVar48 < 0) {
                  iVar63 = -(int)((ulong)(0x80 - lVar48) >> 8);
                }
                else {
                  iVar63 = (int)((ulong)(lVar48 + 0x80) >> 8);
                }
                lVar48 = (long)(iVar96 * 8 + -0x20000) + (long)iVar59 * (long)iVar96;
                if (lVar48 < 0) {
                  iVar59 = -(int)((ulong)(0x80 - lVar48) >> 8);
                }
                else {
                  iVar59 = (int)((ulong)(lVar48 + 0x80) >> 8);
                }
                iVar63 = iVar63 >> 6;
                iVar59 = iVar59 >> 6;
              }
            }
          }
          iVar47 = (pYVar30->field_4).field_0.uv_stride;
          uVar23 = (*cpi->ppi->fn_ptr[uVar84].sdf)
                             (pbVar51->buf,pbVar51->stride,
                              pYVar30->store_buf_adr[(ulong)(lVar27 != 0) - 3] +
                              (long)iVar59 * (long)iVar47 + (long)iVar63,iVar47);
        }
        if (uVar64 != 0xffffffff) {
          pMVar15 = *(x->e_mbd).mi;
          uVar24._0_1_ = pMVar15->bsize;
          uVar24._1_1_ = pMVar15->partition;
          uVar24._2_1_ = pMVar15->mode;
          uVar24._3_1_ = pMVar15->uv_mode;
          uVar22 = (uint)((0x20005UL >> ((ulong)uVar24 & 0x3f) & 1) != 0);
          if (piVar32[1] == 0) {
            uVar22 = 0;
          }
          uVar24 = (uint)((0x10003UL >> ((ulong)uVar24 & 0x3f) & 1) != 0);
          if (*piVar32 == 0) {
            uVar24 = 0;
          }
          iVar63 = (int)((~uVar24 & (x->e_mbd).mi_col) << 2) >> ((byte)*piVar32 & 0x1f);
          iVar59 = (int)((~uVar22 & (x->e_mbd).mi_row) << 2) >> ((byte)piVar32[1] & 0x1f);
          if (iVar41 != -1) {
            iVar47 = psVar57->x_scale_fp;
            if ((long)iVar47 != -1) {
              iVar96 = psVar57->y_scale_fp;
              if (((long)iVar96 != -1) && (iVar96 != 0x4000 || iVar47 != 0x4000)) {
                lVar48 = (long)(iVar47 * 8 + -0x20000) + (long)iVar63 * (long)iVar47;
                if (lVar48 < 0) {
                  iVar63 = -(int)((ulong)(0x80 - lVar48) >> 8);
                }
                else {
                  iVar63 = (int)((ulong)(lVar48 + 0x80) >> 8);
                }
                lVar48 = (long)(iVar96 * 8 + -0x20000) + (long)iVar59 * (long)iVar96;
                if (lVar48 < 0) {
                  iVar59 = -(int)((ulong)(0x80 - lVar48) >> 8);
                }
                else {
                  iVar59 = (int)((ulong)(lVar48 + 0x80) >> 8);
                }
                iVar63 = iVar63 >> 6;
                iVar59 = iVar59 >> 6;
              }
            }
          }
          iVar47 = (pYVar50->field_4).field_0.uv_stride;
          uVar24 = (*cpi->ppi->fn_ptr[uVar84].sdf)
                             (pbVar51->buf,pbVar51->stride,
                              pYVar50->store_buf_adr[(ulong)(lVar27 != 0) - 3] +
                              (long)iVar59 * (long)iVar47 + (long)iVar63,iVar47);
        }
      }
      if (uVar76 >> sVar37 < uv_sad[lVar27]) {
        x->color_sensitivity_sb[lVar27] = '\x01';
      }
      else if (uv_sad[lVar27] < uVar76 >> bVar38) {
        x->color_sensitivity_sb[lVar27] = '\0';
      }
      else {
        x->color_sensitivity_sb[lVar27] = '\x02';
      }
      x->color_sensitivity_sb_g[lVar27] = uVar20 / uVar40 < uVar23;
      x->color_sensitivity_sb_alt[lVar27] = uVar64 / uVar40 < uVar24;
      lVar27 = lVar27 + 1;
      piVar32 = piVar32 + 0x28c;
      pbVar51 = (buf_2d *)((long)(pbVar51 + 4) + 8);
    } while (lVar27 != 2);
  }
  x->force_zeromv_skip_for_sb = 0;
  piVar32 = (int *)aom_malloc(0x58);
  if (piVar32 == (int *)0x0) {
    aom_internal_error((x->e_mbd).error_info,AOM_CODEC_MEM_ERROR,"Failed to allocate vt");
  }
  *(VP64x64 **)(piVar32 + 0x14) = td->vt64x64;
  if ((((bVar81 == false) && (iVar41 = (cpi->sf).rt_sf.part_early_exit_zeromv, iVar41 != 0)) &&
      (local_200 = (short)uVar54,
      (bool)(local_200 == 0 & bVar16 & 0x1e < (cpi->rc).frames_since_key))) &&
     (((*(x->e_mbd).mi)->mv[0].as_int == 0 &&
      (iVar59 = (cpi->sf).rt_sf.set_zeromv_skip_based_on_source_sad, iVar59 != 0)))) {
    SVar11 = (x->content_state_sb).source_sad_nonrd;
    if (iVar59 < 3) {
      if (iVar59 == 2) {
        bVar79 = SVar11 < kLowSad;
      }
      else {
        bVar79 = SVar11 == kZeroSad && 0 < iVar59;
      }
    }
    else {
      bVar79 = SVar11 < kMedSad;
    }
    if (bVar79) {
      BVar7 = ((cpi->common).seq_params)->sb_size;
      if ((int)((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [BVar7] + mi_col) <= tile->mi_col_end) {
        bVar79 = (cpi->sf).rt_sf.increase_source_sad_thresh != 0;
        uVar20 = cpi->zeromv_skip_thresh_exit_part[bsize] << bVar79;
        uVar64 = (uVar20 * 3 >> 2) << bVar79;
        uVar54 = uVar64 >> 3;
        if (iVar41 != 1) {
          uVar54 = uVar64;
        }
        if (SVar11 == kZeroSad) {
          uVar54 = uVar64;
        }
        if ((((int)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [BVar7] + mi_row) <= tile->mi_row_end) && (uVar75 < uVar20)) &&
           ((uv_sad[0] < uVar54 && (uv_sad[1] < uVar54)))) {
          if ((mi_col < (cpi->common).mi_params.mi_cols) &&
             (mi_row < (cpi->common).mi_params.mi_rows)) {
            iVar62 = (mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                          [(cpi->common).mi_params.mi_alloc_bsize]) *
                     (cpi->common).mi_params.mi_alloc_stride +
                     mi_col / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                         [(cpi->common).mi_params.mi_alloc_bsize];
            pMVar14 = (cpi->common).mi_params.mi_alloc;
            (cpi->common).mi_params.mi_grid_base
            [(cpi->common).mi_params.mi_stride * mi_row + mi_col] = pMVar14 + iVar62;
            pMVar14[iVar62].bsize = bsize;
          }
          x->force_zeromv_skip_for_sb = 1;
          goto LAB_0024ebd1;
        }
      }
      if (1 < iVar41 && SVar11 == kZeroSad) {
        x->force_zeromv_skip_for_sb = 2;
      }
    }
  }
  if ((cpi->noise_estimate).enabled == 0) {
    bVar79 = false;
  }
  else {
    NVar25 = av1_noise_estimate_extract_level(&cpi->noise_estimate);
    bVar79 = kLow < NVar25;
  }
  iVar41 = (uint)(BVar4 != BLOCK_64X64) * 0x40;
  iVar59 = (x->e_mbd).mb_to_right_edge;
  iVar63 = (x->e_mbd).mb_to_bottom_edge;
  iVar59 = (iVar59 >> 0x1f & iVar59 >> 3) + iVar41 + 0x40;
  iVar41 = (iVar63 >> 0x1f & iVar63 >> 3) + 0x40U + iVar41;
  uVar54 = (uint)(byte)((cpi->sf).rt_sf.use_rtc_tf != 0 & ~bVar81);
  lVar27 = 0xf8;
  lVar48 = 0x148;
  local_208 = 0;
  do {
    local_140 = local_208 * 4;
    local_1b7[local_208] = '\0';
    lVar73 = local_208 * 4 + -0x1b3;
    local_148 = avg_16x16[local_208];
    local_150 = maxvar_16x16[local_208];
    local_158 = minvar_16x16[local_208];
    local_160 = lVar27;
    lVar58 = 0;
    lVar66 = lVar48;
    do {
      local_1b3[lVar58 + lVar73 + 0x1b3] = '\0';
      local_120 = local_148 + lVar58;
      local_148[lVar58] = 0;
      local_128 = local_150 + lVar58;
      local_150[lVar58] = 0;
      local_130 = local_158 + lVar58;
      local_158[lVar58] = 0x7fffffff;
      lVar34 = (local_140 + lVar58) * 4 + -0x1a3;
      local_138 = lVar66;
      lVar72 = 0;
      lVar69 = lVar27;
      do {
        uVar20 = ((uint)lVar72 & 1) << 4 | ((uint)lVar58 & 1) << 5 | ((uint)local_208 & 1) << 6;
        uVar64 = (((uint)lVar58 & 2) << 4 | ((uint)local_208 & 0x7fffffe) << 5) +
                 ((uint)lVar72 & 2) * 8;
        lVar33 = *(long *)(piVar32 + 0x14);
        aPStack_1a3[lVar72 + lVar34 + 0x1a3] = '\0';
        if (bVar81 == false) {
          if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
            sse[0] = 0;
            sse[1] = 0;
            sse[2] = 0;
            sse[3] = 0;
            max_var_32x32 = (int  [4])ZEXT816(0);
            bVar80 = true;
            uVar76 = 0;
            uVar75 = 0;
            do {
              if (iVar59 <= (int)(uVar75 & 8 | uVar20)) {
                bVar80 = false;
              }
              if (iVar41 <= (int)(uVar76 & 8 | uVar64)) {
                bVar80 = false;
              }
              uVar75 = uVar75 + 8;
              uVar76 = uVar76 + 4;
            } while (uVar75 != 0x20);
            if (bVar80) {
              (*aom_avg_8x8_quad)(puVar61,iVar62,uVar20,uVar64,min_var_32x32);
              (*aom_avg_8x8_quad)(local_2f8,iVar77,uVar20,uVar64,&local_108);
              iVar82 = min_var_32x32[0] - local_108;
              iVar86 = min_var_32x32[1] - iStack_104;
              iVar87 = min_var_32x32[2] - iStack_100;
              iVar89 = min_var_32x32[3] - iStack_fc;
              max_var_32x32[0] = iVar82;
              max_var_32x32[1] = iVar86;
              max_var_32x32[2] = iVar87;
              max_var_32x32[3] = iVar89;
              uVar83 = iVar82 * iVar82;
              sse[0] = uVar83;
              sse[1] = iVar86 * iVar86;
            }
            else {
              uVar76 = 0;
              lVar74 = 0;
              do {
                uVar75 = uVar76 & 8 | uVar20;
                if (((int)uVar75 < iVar59) &&
                   (uVar40 = (uint)lVar74 & 8 | uVar64, (int)uVar40 < iVar41)) {
                  uVar23 = aom_avg_8x8_sse2(puVar61 + (long)(int)(uVar40 * iVar62) + (ulong)uVar75,
                                            iVar62);
                  uVar75 = aom_avg_8x8_sse2(local_2f8 + (long)(int)(uVar40 * iVar77) + (ulong)uVar75
                                            ,iVar77);
                  iVar63 = uVar23 - uVar75;
                  *(int *)((long)max_var_32x32 + lVar74) = iVar63;
                  *(int *)((long)sse + lVar74) = iVar63 * iVar63;
                }
                lVar74 = lVar74 + 4;
                uVar76 = uVar76 + 8;
              } while (lVar74 != 0x10);
            }
            puVar43 = (undefined4 *)(lVar69 + lVar33);
            lVar74 = 0;
            do {
              iVar63 = max_var_32x32[lVar74];
              puVar43[-2] = sse[lVar74];
              puVar43[-1] = iVar63;
              *puVar43 = 0;
              lVar74 = lVar74 + 1;
              puVar43 = puVar43 + 0xa4;
            } while (lVar74 != 4);
          }
          else {
            puVar43 = (undefined4 *)(lVar33 + lVar69);
            uVar76 = 0;
            lVar74 = 0;
            do {
              uVar75 = uVar76 & 8 | uVar20;
              iVar47 = 0;
              iVar63 = 0;
              if (((int)uVar75 < iVar59) &&
                 (uVar40 = (uint)lVar74 & 8 | uVar64, (int)uVar40 < iVar41)) {
                uVar23 = aom_highbd_avg_8x8_c
                                   (puVar61 + (long)(int)(uVar40 * iVar62) + (ulong)uVar75,iVar62);
                uVar75 = aom_highbd_avg_8x8_c
                                   (local_2f8 + (long)(int)(uVar40 * iVar77) + (ulong)uVar75,iVar77)
                ;
                iVar47 = uVar23 - uVar75;
                iVar63 = iVar47 * iVar47;
              }
              puVar43[-2] = iVar63;
              puVar43[-1] = iVar47;
              *puVar43 = 0;
              lVar74 = lVar74 + 4;
              puVar43 = puVar43 + 0xa4;
              uVar76 = uVar76 + 8;
            } while (lVar74 != 0x10);
          }
          lVar74 = lVar72 * 0xa90;
          lVar53 = lVar33 + local_208 * 0xaa90 + lVar58 * 0x2a90 + lVar74;
          sse._0_8_ = lVar53 + 0xa0;
          sse[2] = 0;
          sse[3] = 0;
          lVar33 = lVar53 + 0xf0;
          lVar35 = 1;
          auVar85._8_4_ = (int)lVar33;
          auVar85._0_8_ = lVar33;
          auVar85._12_4_ = (int)((ulong)lVar33 >> 0x20);
          uVar84 = 0;
          uVar90 = 1;
          do {
            *(ulong *)(sse + lVar35 * 2) =
                 ((uVar84 >> 0x20) * 0x290 << 0x20) + (uVar84 & 0xffffffff) * 0x290 + lVar33;
            *(ulong *)(sse + lVar35 * 2 + 2) =
                 ((uVar90 >> 0x20) * 0x290 << 0x20) + (uVar90 & 0xffffffff) * 0x290 + auVar85._8_8_;
            uVar84 = uVar84 + 2;
            uVar90 = uVar90 + 2;
            lVar35 = lVar35 + 2;
          } while (lVar35 != 5);
          iVar63 = *(int *)(sse._8_8_ + 8);
          *(ulong *)(lVar53 + 0xb0) =
               CONCAT44((int)((ulong)uRam0000000000000000 >> 0x20) +
                        (int)((ulong)*(undefined8 *)sse._8_8_ >> 0x20),
                        (int)uRam0000000000000000 + (int)*(undefined8 *)sse._8_8_);
          *(int *)(lVar53 + 0xb8) = iVar63 + 1;
          iVar63 = iRam0000000000000008 + 1;
          *(ulong *)(lVar53 + 0xc0) =
               CONCAT44((int)((ulong)uRam0000000000000000 >> 0x20) * 2,(int)uRam0000000000000000 * 2
                       );
          *(int *)(lVar53 + 200) = iVar63;
          iVar63 = *(int *)(sse._8_8_ + 8);
          *(int *)(lVar53 + 0xd8) = iVar63 + 1;
          *(int *)(lVar53 + 0xe8) = iRam0000000000000008 + 1;
          iVar42 = (int)uRam0000000000000000 + (int)*(undefined8 *)sse._8_8_;
          iVar26 = (int)((ulong)uRam0000000000000000 >> 0x20) +
                   (int)((ulong)*(undefined8 *)sse._8_8_ >> 0x20);
          *(ulong *)(lVar53 + 0xd0) = CONCAT44(iVar26,iVar42);
          iVar47 = (int)uRam0000000000000000 * 2;
          iVar96 = (int)((ulong)uRam0000000000000000 >> 0x20) * 2;
          *(ulong *)(lVar53 + 0xe0) = CONCAT44(iVar96,iVar47);
          *(ulong *)sse._0_8_ = CONCAT44(iVar96 + iVar26,iVar47 + iVar42);
          *(int *)(lVar53 + 0xa8) = iVar63 + 2;
          lVar33 = local_208 * 0xaa90 + *(long *)(piVar32 + 0x14) + lVar58 * 0x2a90;
          lVar53 = (long)*(int *)(lVar74 + 0xa4 + lVar33);
          bVar38 = *(byte *)(lVar74 + 0xa8 + lVar33);
          uVar64 = (uint)((*(int *)(lVar74 + 0xa0 + lVar33) -
                          (int)((ulong)(lVar53 * lVar53) >> (bVar38 & 0x3f))) * 0x100) >>
                   (bVar38 & 0x1f);
          *(uint *)(lVar74 + 0xac + lVar33) = uVar64;
          *local_120 = *local_120 + uVar64;
          uVar20 = *local_130;
          if ((int)uVar64 <= *local_130) {
            uVar20 = uVar64;
          }
          *local_130 = uVar20;
          uVar20 = *local_128;
          if (*local_128 <= (int)uVar64) {
            uVar20 = uVar64;
          }
          *local_128 = uVar20;
          if (iStack_230 < (int)uVar64) {
            aPStack_1a3[lVar72 + lVar34 + 0x1a3] = '\x01';
            local_1b3[lVar58 + lVar73 + 0x1b3] = '\x01';
            local_1b7[local_208] = '\x01';
            local_1b8 = '\x01';
          }
        }
        else {
          puVar43 = (undefined4 *)(lVar33 + lVar66);
          lVar33 = 0;
          do {
            uVar76 = ((x->e_mbd).cur_buf)->flags;
            uVar75 = 0;
            lVar74 = 0;
            puVar52 = puVar43;
            do {
              uVar40 = uVar75 & 4 | (int)lVar33 * 8 & 8U | uVar20;
              iVar47 = 0;
              iVar63 = 0;
              if (((int)uVar40 < (int)(iVar59 + uVar54 * -4)) &&
                 (uVar23 = (uint)lVar74 & 4 | (int)lVar33 * 4 & 8U | uVar64,
                 (int)uVar23 < (int)(iVar41 + uVar54 * -4))) {
                if ((uVar76 & 8) == 0) {
                  uVar40 = aom_avg_4x4_sse2(puVar61 + (long)(int)(uVar23 * iVar62) + (ulong)uVar40,
                                            iVar62);
                }
                else {
                  uVar40 = aom_highbd_avg_4x4_c
                                     (puVar61 + (long)(int)(uVar23 * iVar62) + (ulong)uVar40,iVar62)
                  ;
                }
                iVar63 = uVar40 - 0x80;
                iVar47 = iVar63 * iVar63;
              }
              puVar52[-2] = iVar47;
              puVar52[-1] = iVar63;
              *puVar52 = 0;
              lVar74 = lVar74 + 2;
              puVar52 = puVar52 + 0x24;
              uVar75 = uVar75 + 4;
            } while (lVar74 != 8);
            lVar33 = lVar33 + 1;
            puVar43 = puVar43 + 0xa4;
          } while (lVar33 != 4);
        }
        lVar72 = lVar72 + 1;
        lVar69 = lVar69 + 0xa90;
        lVar66 = lVar66 + 0xa90;
      } while (lVar72 != 4);
      lVar58 = lVar58 + 1;
      lVar27 = lVar27 + 0x2a90;
      lVar66 = local_138 + 0x2a90;
    } while (lVar58 != 4);
    if (BVar4 == BLOCK_64X64) break;
    lVar27 = local_160 + 0xaa90;
    lVar48 = lVar48 + 0xaa90;
    bVar80 = local_208 < 3;
    local_208 = local_208 + 1;
  } while (bVar80);
  uVar90 = (ulong)((uint)(BVar4 != BLOCK_64X64) * 3 + 1);
  local_2e8 = 0x7fffffff;
  lVar27 = 0;
  uVar88 = 0;
  uVar91 = 1;
  iVar62 = 0;
  uVar54 = 0;
  uVar84 = 0;
  do {
    max_var_32x32[uVar84] = 0;
    min_var_32x32[uVar84] = 0x7fffffff;
    uVar1 = uVar84 + 1;
    lVar73 = uVar84 * 0xaa90;
    lVar66 = 0;
    lVar48 = lVar27;
    do {
      lVar34 = uVar84 * 4 + 5 + lVar66;
      lVar69 = lVar66 * 0x2a90;
      lVar72 = 0;
      lVar58 = lVar48;
      do {
        if (bVar81 != false) {
          lVar53 = *(long *)(piVar32 + 0x14);
          lVar33 = lVar53 + lVar73 + lVar69;
          lVar74 = lVar72 * 0xa90 + lVar33;
          lVar33 = lVar72 * 0xa90 + lVar33;
          lVar35 = 0;
          do {
            puVar2 = (undefined8 *)(lVar33 + 0xf0 + lVar35 * 0x290);
            sse[2] = 0;
            sse[3] = 0;
            lVar3 = lVar33 + 0x140 + lVar35 * 0x290;
            lVar60 = 1;
            auVar93._8_4_ = (int)lVar3;
            auVar93._0_8_ = lVar3;
            auVar93._12_4_ = (int)((ulong)lVar3 >> 0x20);
            uVar95 = uVar88;
            uVar97 = uVar91;
            do {
              *(ulong *)(sse + lVar60 * 2) =
                   ((uVar95 >> 0x20) * 0x90 << 0x20) + (uVar95 & 0xffffffff) * 0x90 + lVar3;
              *(ulong *)(sse + lVar60 * 2 + 2) =
                   ((uVar97 >> 0x20) * 0x90 << 0x20) + (uVar97 & 0xffffffff) * 0x90 + auVar93._8_8_;
              uVar95 = uVar95 + 2;
              uVar97 = uVar97 + 2;
              lVar60 = lVar60 + 2;
            } while (lVar60 != 5);
            iVar77 = *(int *)(sse._8_8_ + 8);
            puVar2[2] = CONCAT44((int)((ulong)uRam0000000000000000 >> 0x20) +
                                 (int)((ulong)*(undefined8 *)sse._8_8_ >> 0x20),
                                 (int)uRam0000000000000000 + (int)*(undefined8 *)sse._8_8_);
            *(int *)(puVar2 + 3) = iVar77 + 1;
            iVar77 = iRam0000000000000008 + 1;
            puVar2[4] = CONCAT44((int)((ulong)uRam0000000000000000 >> 0x20) * 2,
                                 (int)uRam0000000000000000 * 2);
            *(int *)(puVar2 + 5) = iVar77;
            iVar77 = *(int *)(sse._8_8_ + 8);
            *(int *)(puVar2 + 7) = iVar77 + 1;
            *(int *)(puVar2 + 9) = iRam0000000000000008 + 1;
            iVar63 = (int)uRam0000000000000000 + (int)*(undefined8 *)sse._8_8_;
            iVar47 = (int)((ulong)uRam0000000000000000 >> 0x20) +
                     (int)((ulong)*(undefined8 *)sse._8_8_ >> 0x20);
            puVar2[6] = CONCAT44(iVar47,iVar63);
            iVar41 = (int)uRam0000000000000000 * 2;
            iVar59 = (int)((ulong)uRam0000000000000000 >> 0x20) * 2;
            puVar2[8] = CONCAT44(iVar59,iVar41);
            *puVar2 = CONCAT44(iVar59 + iVar47,iVar41 + iVar63);
            *(int *)(puVar2 + 1) = iVar77 + 2;
            lVar35 = lVar35 + 1;
          } while (lVar35 != 4);
          sse[2] = 0;
          sse[3] = 0;
          lVar33 = lVar74 + 0xf0;
          lVar35 = 1;
          auVar94._8_4_ = (int)lVar33;
          auVar94._0_8_ = lVar33;
          auVar94._12_4_ = (int)((ulong)lVar33 >> 0x20);
          uVar95 = uVar88;
          uVar97 = uVar91;
          do {
            *(ulong *)(sse + lVar35 * 2) =
                 ((uVar95 >> 0x20) * 0x290 << 0x20) + (uVar95 & 0xffffffff) * 0x290 + lVar33;
            *(ulong *)(sse + lVar35 * 2 + 2) =
                 ((uVar97 >> 0x20) * 0x290 << 0x20) + (uVar97 & 0xffffffff) * 0x290 + auVar94._8_8_;
            uVar95 = uVar95 + 2;
            uVar97 = uVar97 + 2;
            lVar35 = lVar35 + 2;
          } while (lVar35 != 5);
          iVar77 = *(int *)(sse._8_8_ + 8);
          *(ulong *)(lVar74 + 0xb0) =
               CONCAT44((int)((ulong)uRam0000000000000000 >> 0x20) +
                        (int)((ulong)*(undefined8 *)sse._8_8_ >> 0x20),
                        (int)uRam0000000000000000 + (int)*(undefined8 *)sse._8_8_);
          *(int *)(lVar74 + 0xb8) = iVar77 + 1;
          iVar77 = iRam0000000000000008 + 1;
          *(ulong *)(lVar74 + 0xc0) =
               CONCAT44((int)((ulong)uRam0000000000000000 >> 0x20) * 2,(int)uRam0000000000000000 * 2
                       );
          *(int *)(lVar74 + 200) = iVar77;
          iVar77 = *(int *)(sse._8_8_ + 8);
          iVar47 = (int)uRam0000000000000000 + (int)*(undefined8 *)sse._8_8_;
          iVar96 = (int)((ulong)uRam0000000000000000 >> 0x20) +
                   (int)((ulong)*(undefined8 *)sse._8_8_ >> 0x20);
          *(ulong *)(lVar74 + 0xd0) = CONCAT44(iVar96,iVar47);
          *(int *)(lVar74 + 0xd8) = iVar77 + 1;
          iVar63 = iRam0000000000000008 + 1;
          iVar41 = (int)uRam0000000000000000 * 2;
          iVar59 = (int)((ulong)uRam0000000000000000 >> 0x20) * 2;
          *(ulong *)(lVar74 + 0xe0) = CONCAT44(iVar59,iVar41);
          *(int *)(lVar74 + 0xe8) = iVar63;
          iVar41 = iVar41 + iVar47;
          iVar59 = iVar59 + iVar96;
          iVar77 = iVar77 + 2;
          bVar38 = (byte)iVar77;
          *(int *)(lVar74 + 0xa0) = iVar41;
          *(int *)(lVar74 + 0xa4) = iVar59;
          uVar20 = (uint)((iVar41 - (int)((ulong)((long)iVar59 * (long)iVar59) >> (bVar38 & 0x3f)))
                         * 0x100) >> (bVar38 & 0x1f);
          *(int *)(lVar74 + 0xa8) = iVar77;
          *(uint *)(lVar74 + 0xac) = uVar20;
          if (iStack_230 < (int)uVar20) {
            PVar19 = '\x01';
            if ((cpi->sf).rt_sf.vbp_prune_16x16_split_using_min_max_sub_blk_var == true) {
              lVar53 = lVar53 + lVar58;
              uVar64 = 0x7fffffff;
              uVar20 = 0;
              lVar33 = 0xfc;
              do {
                lVar74 = (long)*(int *)(lVar53 + -8 + lVar33);
                bVar38 = *(byte *)(lVar53 + -4 + lVar33);
                uVar76 = (uint)((*(int *)(lVar53 + -0xc + lVar33) -
                                (int)((ulong)(lVar74 * lVar74) >> (bVar38 & 0x3f))) * 0x100) >>
                         (bVar38 & 0x1f);
                *(uint *)(lVar53 + lVar33) = uVar76;
                if ((int)uVar20 < (int)uVar76) {
                  uVar20 = uVar76;
                }
                if ((int)uVar64 <= (int)uVar76) {
                  uVar76 = uVar64;
                }
                uVar64 = uVar76;
                lVar33 = lVar33 + 0x290;
              } while (lVar33 != 0xb3c);
              PVar19 = '\x02' - (iStack_230 * 4 < (long)(int)(uVar20 - uVar64));
            }
            aPStack_1a3[(uVar84 * 4 + lVar66) * 4 + lVar72] = PVar19;
            local_1b3[lVar34 + -5] = '\x01';
            local_1b8 = '\x01';
            local_1b7[uVar84] = '\x01';
          }
        }
        lVar72 = lVar72 + 1;
        lVar58 = lVar58 + 0xa90;
      } while (lVar72 != 4);
      lVar74 = *(long *)(piVar32 + 0x14) + lVar73;
      lVar58 = lVar69 + lVar74;
      sse[2] = 0;
      sse[3] = 0;
      sse._0_8_ = (int *)(lVar58 + 0x50);
      lVar72 = lVar69 + lVar74 + 0xa0;
      lVar33 = 1;
      uVar95 = uVar88;
      uVar97 = uVar91;
      do {
        auVar98._8_4_ = (int)lVar72;
        auVar98._0_8_ = lVar72;
        auVar98._12_4_ = (int)((ulong)lVar72 >> 0x20);
        *(ulong *)(sse + lVar33 * 2) =
             lVar72 + (uVar95 & 0xffffffff) * 0xa90 + ((uVar95 >> 0x20) * 0xa90 << 0x20);
        *(ulong *)(sse + lVar33 * 2 + 2) =
             auVar98._8_8_ + (uVar97 & 0xffffffff) * 0xa90 + ((uVar97 >> 0x20) * 0xa90 << 0x20);
        uVar95 = uVar95 + 2;
        uVar97 = uVar97 + 2;
        lVar33 = lVar33 + 2;
      } while (lVar33 != 5);
      iVar77 = *(int *)(sse._8_8_ + 8);
      *(ulong *)(lVar58 + 0x60) =
           CONCAT44((int)((ulong)uRam0000000000000000 >> 0x20) +
                    (int)((ulong)*(undefined8 *)sse._8_8_ >> 0x20),
                    (int)uRam0000000000000000 + (int)*(undefined8 *)sse._8_8_);
      *(int *)(lVar58 + 0x68) = iVar77 + 1;
      iVar77 = iRam0000000000000008 + 1;
      *(ulong *)(lVar58 + 0x70) =
           CONCAT44((int)((ulong)uRam0000000000000000 >> 0x20) * 2,(int)uRam0000000000000000 * 2);
      *(int *)(lVar58 + 0x78) = iVar77;
      iVar77 = *(int *)(sse._8_8_ + 8);
      iVar59 = (int)uRam0000000000000000 + (int)*(undefined8 *)sse._8_8_;
      iVar96 = (int)((ulong)uRam0000000000000000 >> 0x20) +
               (int)((ulong)*(undefined8 *)sse._8_8_ >> 0x20);
      *(ulong *)(lVar58 + 0x80) = CONCAT44(iVar96,iVar59);
      *(int *)(lVar58 + 0x88) = iVar77 + 1;
      iVar41 = iRam0000000000000008 + 1;
      iVar63 = (int)uRam0000000000000000 * 2;
      iVar47 = (int)((ulong)uRam0000000000000000 >> 0x20) * 2;
      *(ulong *)(lVar58 + 0x90) = CONCAT44(iVar47,iVar63);
      *(int *)(lVar58 + 0x98) = iVar41;
      iVar63 = iVar63 + iVar59;
      iVar47 = iVar47 + iVar96;
      iVar77 = iVar77 + 2;
      *(int *)(lVar58 + 0x50) = iVar63;
      *(int *)(lVar58 + 0x54) = iVar47;
      *(int *)(lVar58 + 0x58) = iVar77;
      iVar41 = (cpi->common).height;
      iVar59 = (cpi->common).width;
      uVar95 = 20000;
      if ((2 < (cpi->svc).number_temporal_layers) && ((cpi->svc).temporal_layer_id == 0)) {
        uVar95 = 40000;
      }
      if (local_1b3[lVar34 + -5] == '\0') {
        bVar38 = (byte)iVar77;
        *(uint *)(lVar58 + 0x5c) =
             (uint)((iVar63 - (int)((ulong)((long)iVar47 * (long)iVar47) >> (bVar38 & 0x3f))) *
                   0x100) >> (bVar38 & 0x1f);
        iVar77 = *(int *)(lVar69 + 0x5c + lVar74);
        iVar63 = max_var_32x32[uVar84];
        if (max_var_32x32[uVar84] < iVar77) {
          iVar63 = iVar77;
        }
        iVar47 = min_var_32x32[uVar84];
        if (iVar77 < min_var_32x32[uVar84]) {
          iVar47 = iVar77;
        }
        max_var_32x32[uVar84] = iVar63;
        min_var_32x32[uVar84] = iVar47;
        if (local_238 < iVar77) {
LAB_0024de0b:
          local_1b3[lVar34 + -5] = '\x01';
          local_1b8 = '\x01';
          local_1b7[uVar84] = '\x01';
        }
        else if (bVar81 == false) {
          iVar63 = maxvar_16x16[uVar84][lVar66];
          lVar58 = (long)iVar63;
          iVar47 = minvar_16x16[uVar84][lVar66];
          if ((local_238 >> 1 < (long)iVar77) && (avg_16x16[uVar84][lVar66] >> 1 < iVar77))
          goto LAB_0024de0b;
          if ((iVar41 * iVar59 < 0x38401) &&
             ((local_238 >> 1 < lVar58 - iVar47 && local_238 < lVar58 ||
              (((((cpi->sf).rt_sf.prefer_large_partition_blocks != 0 &&
                 (kLowSad < (x->content_state_sb).source_sad_nonrd)) &&
                ((cpi->rc).frame_source_sad < uVar95)) &&
               ((local_238 >> 4 < lVar58 &&
                (iVar63 != iVar47 * 4 && SBORROW4(iVar63,iVar47 * 4) == iVar63 + iVar47 * -4 < 0))))
              )))) {
            local_1b3[lVar34 + -5] = '\x01';
            local_1b8 = '\x01';
            local_1b7[uVar84] = '\x01';
          }
        }
      }
      lVar66 = lVar66 + 1;
      lVar48 = lVar48 + 0x2a90;
    } while (lVar66 != 4);
    if (local_1b7[uVar84] == '\0') {
      lVar48 = *(long *)(piVar32 + 0x14);
      sse._0_8_ = lVar48 + lVar73;
      sse[2] = 0;
      sse[3] = 0;
      lVar66 = lVar48 + lVar73 + 0x50;
      lVar58 = 1;
      uVar95 = uVar88;
      uVar97 = uVar91;
      do {
        auVar99._8_4_ = (int)lVar66;
        auVar99._0_8_ = lVar66;
        auVar99._12_4_ = (int)((ulong)lVar66 >> 0x20);
        *(ulong *)(sse + lVar58 * 2) =
             lVar66 + (uVar95 & 0xffffffff) * 0x2a90 + ((uVar95 >> 0x20) * 0x2a90 << 0x20);
        *(ulong *)(sse + lVar58 * 2 + 2) =
             auVar99._8_8_ + (uVar97 & 0xffffffff) * 0x2a90 + ((uVar97 >> 0x20) * 0x2a90 << 0x20);
        uVar95 = uVar95 + 2;
        uVar97 = uVar97 + 2;
        lVar58 = lVar58 + 2;
      } while (lVar58 != 5);
      iVar77 = *(int *)(sse._8_8_ + 8);
      *(ulong *)(sse._0_8_ + 0x10) =
           CONCAT44((int)((ulong)uRam0000000000000000 >> 0x20) +
                    (int)((ulong)*(undefined8 *)sse._8_8_ >> 0x20),
                    (int)uRam0000000000000000 + (int)*(undefined8 *)sse._8_8_);
      *(int *)(sse._0_8_ + 0x18) = iVar77 + 1;
      iVar77 = iRam0000000000000008 + 1;
      *(ulong *)(sse._0_8_ + 0x20) =
           CONCAT44((int)((ulong)uRam0000000000000000 >> 0x20) * 2,(int)uRam0000000000000000 * 2);
      *(int *)(sse._0_8_ + 0x28) = iVar77;
      iVar77 = *(int *)(sse._8_8_ + 8);
      iVar47 = (int)uRam0000000000000000 + (int)*(undefined8 *)sse._8_8_;
      iVar96 = (int)((ulong)uRam0000000000000000 >> 0x20) +
               (int)((ulong)*(undefined8 *)sse._8_8_ >> 0x20);
      *(ulong *)(sse._0_8_ + 0x30) = CONCAT44(iVar96,iVar47);
      *(int *)(sse._0_8_ + 0x38) = iVar77 + 1;
      iVar63 = iRam0000000000000008 + 1;
      iVar41 = (int)uRam0000000000000000 * 2;
      iVar59 = (int)((ulong)uRam0000000000000000 >> 0x20) * 2;
      *(ulong *)(sse._0_8_ + 0x40) = CONCAT44(iVar59,iVar41);
      *(int *)(sse._0_8_ + 0x48) = iVar63;
      iVar41 = iVar41 + iVar47;
      iVar59 = iVar59 + iVar96;
      iVar77 = iVar77 + 2;
      *(int *)sse._0_8_ = iVar41;
      *(int *)(sse._0_8_ + 4) = iVar59;
      bVar38 = (byte)iVar77;
      *(int *)(sse._0_8_ + 8) = iVar77;
      *(uint *)(sse._0_8_ + 0xc) =
           (uint)((iVar41 - (int)((ulong)((long)iVar59 * (long)iVar59) >> (bVar38 & 0x3f))) * 0x100)
           >> (bVar38 & 0x1f);
      uVar20 = *(uint *)(lVar48 + 0xc + lVar73);
      if ((int)uVar54 < (int)uVar20) {
        uVar54 = uVar20;
      }
      if ((int)uVar20 < (int)local_2e8) {
        local_2e8 = uVar20;
      }
      if ((bVar79) || (cpi->ppi->use_svc != 0)) {
        bVar80 = false;
      }
      else {
        bVar80 = (cpi->sf).rt_sf.prefer_large_partition_blocks == 0;
      }
      if ((bVar81 == false) &&
         (!(bool)((long)max_var_32x32[uVar84] <= iStack_240 >> 1 | bVar80 |
                 (long)max_var_32x32[uVar84] - (long)min_var_32x32[uVar84] <= (iStack_240 >> 3) * 3)
         )) {
        local_1b7[uVar84] = '\x01';
        local_1b8 = '\x01';
      }
      iVar62 = iVar62 + uVar20;
    }
    if (BVar4 == BLOCK_64X64) {
      local_1b8 = '\x01';
    }
    lVar27 = lVar27 + 0xaa90;
    uVar84 = uVar1;
  } while (uVar1 != uVar90);
  if (local_1b8 == '\0') {
    sse[2] = 0;
    sse[3] = 0;
    sse._0_8_ = piVar32;
    uVar84 = 0;
    uVar88 = 1;
    lVar48 = 1;
    lVar27 = *(long *)(piVar32 + 0x14);
    auVar92._8_4_ = (int)lVar27;
    auVar92._0_8_ = lVar27;
    auVar92._12_4_ = (int)((ulong)lVar27 >> 0x20);
    do {
      *(ulong *)(sse + lVar48 * 2) =
           ((uVar84 >> 0x20) * 0xaa90 << 0x20) + (uVar84 & 0xffffffff) * 0xaa90 + lVar27;
      *(ulong *)(sse + lVar48 * 2 + 2) =
           ((uVar88 >> 0x20) * 0xaa90 << 0x20) + (uVar88 & 0xffffffff) * 0xaa90 + auVar92._8_8_;
      uVar84 = uVar84 + 2;
      uVar88 = uVar88 + 2;
      lVar48 = lVar48 + 2;
    } while (lVar48 != 5);
    iVar77 = *(int *)(sse._8_8_ + 8);
    *(ulong *)(piVar32 + 4) =
         CONCAT44((int)((ulong)uRam0000000000000000 >> 0x20) +
                  (int)((ulong)*(undefined8 *)sse._8_8_ >> 0x20),
                  (int)uRam0000000000000000 + (int)*(undefined8 *)sse._8_8_);
    piVar32[6] = iVar77 + 1;
    iVar77 = iRam0000000000000008 + 1;
    *(ulong *)(piVar32 + 8) =
         CONCAT44((int)((ulong)uRam0000000000000000 >> 0x20) * 2,(int)uRam0000000000000000 * 2);
    piVar32[10] = iVar77;
    iVar77 = *(int *)(sse._8_8_ + 8);
    iVar47 = (int)uRam0000000000000000 + (int)*(undefined8 *)sse._8_8_;
    iVar96 = (int)((ulong)uRam0000000000000000 >> 0x20) +
             (int)((ulong)*(undefined8 *)sse._8_8_ >> 0x20);
    *(ulong *)(piVar32 + 0xc) = CONCAT44(iVar96,iVar47);
    piVar32[0xe] = iVar77 + 1;
    iVar63 = iRam0000000000000008 + 1;
    iVar41 = (int)uRam0000000000000000 * 2;
    iVar59 = (int)((ulong)uRam0000000000000000 >> 0x20) * 2;
    *(ulong *)(piVar32 + 0x10) = CONCAT44(iVar59,iVar41);
    piVar32[0x12] = iVar63;
    iVar41 = iVar41 + iVar47;
    iVar59 = iVar59 + iVar96;
    iVar77 = iVar77 + 2;
    bVar38 = (byte)iVar77;
    *piVar32 = iVar41;
    uVar20 = (uint)((iVar41 - (int)((ulong)((long)iVar59 * (long)iVar59) >> (bVar38 & 0x3f))) *
                   0x100) >> (bVar38 & 0x1f);
    piVar32[1] = iVar59;
    piVar32[2] = iVar77;
    piVar32[3] = uVar20;
    if (bVar81 == false) {
      if (iVar62 * 9 >> 5 < (int)uVar20) {
        local_1b8 = '\x01';
      }
      if (local_248 >> 1 < (long)(ulong)uVar54 &&
          (local_248 >> 3) * 3 < (long)(int)(uVar54 - local_2e8)) {
        local_1b8 = '\x01';
      }
    }
  }
  if (((tile->mi_col_end < mi_col + 0x20) || (tile->mi_row_end < mi_row + 0x20)) ||
     (iVar62 = set_vt_partitioning(cpi,xd_00,tile,piVar32,BLOCK_128X128,mi_row,mi_col,local_248,
                                   BLOCK_16X16,local_1b8), iVar62 == 0)) {
    threshold_01 = iStack_230;
    threshold_00 = local_238;
    threshold = iStack_240;
    uVar84 = 0;
    do {
      lVar27 = uVar84 * 0xaa90;
      iVar77 = mi_row + ((uint)uVar84 & 0xfffffffe) * 8;
      iVar41 = ((uint)uVar84 & 1) * 0x10 + mi_col;
      iVar62 = set_vt_partitioning(cpi,xd_00,tile,(void *)(*(long *)(piVar32 + 0x14) + lVar27),
                                   BLOCK_64X64,iVar77,iVar41,threshold,BLOCK_16X16,local_1b7[uVar84]
                                  );
      if (iVar62 == 0) {
        lVar48 = 0;
        do {
          iVar63 = iVar77 + ((uint)lVar48 & 2) * 4;
          iVar59 = iVar41 + ((uint)lVar48 & 1) * 8;
          iVar62 = set_vt_partitioning(cpi,xd_00,tile,
                                       (void *)(*(long *)(piVar32 + 0x14) + lVar27 + lVar48 * 0x2a90
                                               + 0x50),BLOCK_32X32,iVar63,iVar59,threshold_00,
                                       BLOCK_16X16,local_1b3[uVar84 * 4 + lVar48]);
          if (iVar62 == 0) {
            lVar73 = 0;
            do {
              iVar47 = iVar63 + ((uint)lVar73 & 2) * 2;
              iVar96 = iVar59 + ((uint)lVar73 & 1) * 4;
              iVar62 = set_vt_partitioning(cpi,xd_00,tile,
                                           (void *)(*(long *)(piVar32 + 0x14) + lVar27 +
                                                    lVar48 * 0x2a90 + lVar73 * 0xa90 + 0xa0),
                                           BLOCK_16X16,iVar47,iVar96,threshold_01,BLOCK_8X8,
                                           aPStack_1a3[(uVar84 * 4 + lVar48) * 4 + lVar73]);
              if (iVar62 == 0) {
                iVar62 = (cpi->common).mi_params.mi_cols;
                uVar54 = 0;
                uVar20 = 0;
                do {
                  iVar42 = (uVar54 & 2) + iVar96;
                  if ((iVar42 < iVar62) &&
                     (iVar26 = (uVar20 & 2) + iVar47, iVar26 < (cpi->common).mi_params.mi_rows)) {
                    iVar56 = (iVar26 / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                                  [(cpi->common).mi_params.mi_alloc_bsize]) *
                             (cpi->common).mi_params.mi_alloc_stride +
                             iVar42 / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                                 [(cpi->common).mi_params.mi_alloc_bsize];
                    pMVar14 = (cpi->common).mi_params.mi_alloc;
                    (cpi->common).mi_params.mi_grid_base
                    [(cpi->common).mi_params.mi_stride * iVar26 + iVar42] = pMVar14 + iVar56;
                    pMVar14[iVar56].bsize = BLOCK_8X8;
                  }
                  uVar20 = uVar20 + 1;
                  uVar54 = uVar54 + 2;
                } while (uVar20 != 4);
              }
              lVar73 = lVar73 + 1;
            } while (lVar73 != 4);
          }
          lVar48 = lVar48 + 1;
        } while (lVar48 != 4);
      }
      uVar84 = uVar84 + 1;
    } while (uVar84 != uVar90);
  }
  if (bVar16 && (cpi->sf).rt_sf.short_circuit_low_temp_var != 0) {
    lVar27 = local_248 >> 2;
    if (BVar4 == BLOCK_64X64) {
      lVar48 = *(long *)(piVar32 + 0x14);
      BVar4 = (*(x->e_mbd).mi)->bsize;
      if (BVar4 != BLOCK_64X64) {
        if (BVar4 == BLOCK_64X32) {
          piVar36 = (int *)(lVar48 + 0x1c);
          lVar48 = 0;
          do {
            if (*piVar36 < lVar27) {
              *(undefined1 *)((long)(x->thresh_freq_fact + -1) + lVar48 + 0x231) = 1;
            }
            lVar48 = lVar48 + 1;
            piVar36 = piVar36 + 4;
          } while (lVar48 == 1);
        }
        else if (BVar4 == BLOCK_32X64) {
          piVar36 = (int *)(lVar48 + 0x3c);
          lVar48 = 0;
          do {
            if (*piVar36 < lVar27) {
              *(undefined1 *)((long)(x->thresh_freq_fact + -1) + lVar48 + 0x233) = 1;
            }
            lVar48 = lVar48 + 1;
            piVar36 = piVar36 + 4;
          } while (lVar48 == 1);
        }
        else {
          puVar61 = (x->part_search_info).variance_low + 9;
          piVar36 = (int *)(lVar48 + 0xac);
          lVar27 = 0;
          do {
            if ((((&DAT_0050d8c4)[lVar27 * 2] + mi_col < (cpi->common).mi_params.mi_cols) &&
                ((&set_low_temp_var_flag_128x128_idx32)[lVar27 * 2] + mi_row <
                 (cpi->common).mi_params.mi_rows)) &&
               (pMVar14 = (cpi->common).mi_params.mi_grid_base
                          [(&DAT_0050d8c4)[lVar27 * 2] + mi_col +
                           ((&set_low_temp_var_flag_128x128_idx32)[lVar27 * 2] + mi_row) *
                           (cpi->common).mi_params.mi_stride], pMVar14 != (MB_MODE_INFO *)0x0)) {
              BVar4 = pMVar14->bsize;
              if (BVar4 - 6 < 3) {
                lVar73 = 0;
                piVar70 = piVar36;
                do {
                  if ((long)*piVar70 < local_238 >> 8) {
                    puVar61[lVar73] = '\x01';
                  }
                  lVar73 = lVar73 + 1;
                  piVar70 = piVar70 + 0x2a4;
                } while (lVar73 != 4);
              }
              else if ((BVar4 == BLOCK_32X32) &&
                      ((long)*(int *)(lVar48 + 0x5c + lVar27 * 0x2a90) < iStack_240 * 5 >> 3)) {
                *(undefined1 *)((long)(x->thresh_freq_fact + -1) + lVar27 + 0x235) = 1;
              }
            }
            lVar27 = lVar27 + 1;
            puVar61 = puVar61 + 4;
            piVar36 = piVar36 + 0xaa4;
          } while (lVar27 != 4);
        }
        goto LAB_0024ebd1;
      }
      iVar62 = *(int *)(lVar48 + 0xc);
    }
    else {
      BVar4 = (*(x->e_mbd).mi)->bsize;
      if (BVar4 != BLOCK_128X128) {
        if (BVar4 == BLOCK_128X64) {
          piVar36 = piVar32 + 7;
          lVar48 = 0;
          do {
            if (*piVar36 < lVar27) {
              *(undefined1 *)((long)(x->thresh_freq_fact + -1) + lVar48 + 0x231) = 1;
            }
            lVar48 = lVar48 + 1;
            piVar36 = piVar36 + 4;
          } while (lVar48 == 1);
        }
        else if (BVar4 == BLOCK_64X128) {
          piVar36 = piVar32 + 0xf;
          lVar48 = 0;
          do {
            if (*piVar36 < lVar27) {
              *(undefined1 *)((long)(x->thresh_freq_fact + -1) + lVar48 + 0x233) = 1;
            }
            lVar48 = lVar48 + 1;
            piVar36 = piVar36 + 4;
          } while (lVar48 == 1);
        }
        else {
          lVar27 = iStack_240 * 5 >> 4;
          puVar61 = (x->part_search_info).variance_low + 0x11;
          puVar65 = (x->part_search_info).variance_low + 9;
          local_338 = (x->part_search_info).variance_low + 0x29;
          local_2d0 = 0x3c;
          lVar48 = 0x1c;
          lVar66 = 0xac;
          lVar73 = 0;
          do {
            iVar62 = (&set_low_temp_var_flag_128x128_idx64)[lVar73 * 2] + mi_row;
            iVar77 = (&DAT_0050d8a4)[lVar73 * 2] + mi_col;
            lVar58 = (long)((cpi->common).mi_params.mi_stride * iVar62 + iVar77);
            pMVar14 = (cpi->common).mi_params.mi_grid_base[lVar58];
            if (((pMVar14 != (MB_MODE_INFO *)0x0) && (iVar77 < (cpi->common).mi_params.mi_cols)) &&
               (iVar62 < (cpi->common).mi_params.mi_rows)) {
              BVar4 = pMVar14->bsize;
              if (BVar4 == BLOCK_64X64) {
                if ((long)*(int *)(*(long *)(piVar32 + 0x14) + 0xc + lVar73 * 0xaa90) <
                    iStack_240 * 5 >> 3) {
                  *(undefined1 *)((long)(x->thresh_freq_fact + -1) + lVar73 + 0x235) = 1;
                }
              }
              else if (BVar4 == BLOCK_64X32) {
                lVar34 = 0;
                lVar58 = lVar48;
                do {
                  if (*(int *)(*(long *)(piVar32 + 0x14) + lVar58) < lVar27) {
                    puVar65[lVar34] = '\x01';
                  }
                  lVar34 = lVar34 + 1;
                  lVar58 = lVar58 + 0x10;
                } while (lVar34 == 1);
              }
              else if (BVar4 == BLOCK_32X64) {
                lVar34 = 0;
                lVar58 = local_2d0;
                do {
                  if (*(int *)(*(long *)(piVar32 + 0x14) + lVar58) < lVar27) {
                    puVar61[lVar34] = '\x01';
                  }
                  lVar34 = lVar34 + 1;
                  lVar58 = lVar58 + 0x10;
                } while (lVar34 == 1);
              }
              else {
                lVar69 = 0;
                lVar34 = lVar66;
                puVar67 = local_338;
                do {
                  pMVar14 = (cpi->common).mi_params.mi_grid_base
                            [lVar58 + ((cpi->common).mi_params.mi_stride *
                                       (&set_low_temp_var_flag_128x128_idx32)[lVar69 * 2] +
                                      (&DAT_0050d8c4)[lVar69 * 2])];
                  if (((pMVar14 != (MB_MODE_INFO *)0x0) &&
                      ((&DAT_0050d8c4)[lVar69 * 2] + iVar77 < (cpi->common).mi_params.mi_cols)) &&
                     ((&set_low_temp_var_flag_128x128_idx32)[lVar69 * 2] + iVar62 <
                      (cpi->common).mi_params.mi_rows)) {
                    BVar4 = pMVar14->bsize;
                    if (BVar4 - 6 < 3) {
                      lVar33 = 0;
                      lVar72 = lVar34;
                      do {
                        if ((long)*(int *)(*(long *)(piVar32 + 0x14) + lVar72) < iStack_230 >> 8) {
                          puVar67[lVar33] = '\x01';
                        }
                        lVar33 = lVar33 + 1;
                        lVar72 = lVar72 + 0xa90;
                      } while (lVar33 != 4);
                    }
                    else if ((BVar4 == BLOCK_32X32) &&
                            ((long)*(int *)(lVar69 * 0x2a90 + 0x5c +
                                           lVar73 * 0xaa90 + *(long *)(piVar32 + 0x14)) <
                             local_238 * 5 >> 3)) {
                      *(undefined1 *)
                       ((long)(x->thresh_freq_fact + -1) + lVar73 * 4 + lVar69 + 0x249) = 1;
                    }
                  }
                  lVar69 = lVar69 + 1;
                  puVar67 = puVar67 + 4;
                  lVar34 = lVar34 + 0x2a90;
                } while (lVar69 != 4);
              }
            }
            lVar73 = lVar73 + 1;
            puVar61 = puVar61 + 2;
            local_2d0 = local_2d0 + 0xaa90;
            puVar65 = puVar65 + 2;
            lVar48 = lVar48 + 0xaa90;
            local_338 = local_338 + 0x10;
            lVar66 = lVar66 + 0xaa90;
          } while (lVar73 != 4);
        }
        goto LAB_0024ebd1;
      }
      iVar62 = piVar32[3];
    }
    if ((long)iVar62 < local_248 >> 1) {
      (x->part_search_info).variance_low[0] = '\x01';
    }
  }
LAB_0024ebd1:
  aom_free(piVar32);
  return 0;
}

Assistant:

int av1_choose_var_based_partitioning(AV1_COMP *cpi, const TileInfo *const tile,
                                      ThreadData *td, MACROBLOCK *x, int mi_row,
                                      int mi_col) {
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, choose_var_based_partitioning_time);
#endif
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  const int64_t *const vbp_thresholds = cpi->vbp_info.thresholds;
  PART_EVAL_STATUS force_split[85];
  int avg_64x64;
  int max_var_32x32[4];
  int min_var_32x32[4];
  int var_32x32;
  int var_64x64;
  int min_var_64x64 = INT_MAX;
  int max_var_64x64 = 0;
  int avg_16x16[4][4];
  int maxvar_16x16[4][4];
  int minvar_16x16[4][4];
  const uint8_t *src_buf;
  const uint8_t *dst_buf;
  int dst_stride;
  unsigned int uv_sad[MAX_MB_PLANE - 1];
  NOISE_LEVEL noise_level = kLow;
  bool is_zero_motion = true;
  bool scaled_ref_last = false;
  struct scale_factors sf_no_scale;
  av1_setup_scale_factors_for_frame(&sf_no_scale, cm->width, cm->height,
                                    cm->width, cm->height);

  bool is_key_frame =
      (frame_is_intra_only(cm) ||
       (cpi->ppi->use_svc &&
        cpi->svc.layer_context[cpi->svc.temporal_layer_id].is_key_frame));

  assert(cm->seq_params->sb_size == BLOCK_64X64 ||
         cm->seq_params->sb_size == BLOCK_128X128);
  const bool is_small_sb = (cm->seq_params->sb_size == BLOCK_64X64);
  const int num_64x64_blocks = is_small_sb ? 1 : 4;

  unsigned int y_sad = UINT_MAX;
  unsigned int y_sad_g = UINT_MAX;
  unsigned int y_sad_alt = UINT_MAX;
  unsigned int y_sad_last = UINT_MAX;
  BLOCK_SIZE bsize = is_small_sb ? BLOCK_64X64 : BLOCK_128X128;

  // Force skip encoding for all superblocks on slide change for
  // non_reference_frames.
  if (cpi->sf.rt_sf.skip_encoding_non_reference_slide_change &&
      cpi->rc.high_source_sad && cpi->ppi->rtc_ref.non_reference_frame) {
    MB_MODE_INFO **mi = cm->mi_params.mi_grid_base +
                        get_mi_grid_idx(&cm->mi_params, mi_row, mi_col);
    av1_set_fixed_partitioning(cpi, tile, mi, mi_row, mi_col, bsize);
    x->force_zeromv_skip_for_sb = 1;
    return 0;
  }

  // Ref frame used in partitioning.
  MV_REFERENCE_FRAME ref_frame_partition = LAST_FRAME;

  int64_t thresholds[5] = { vbp_thresholds[0], vbp_thresholds[1],
                            vbp_thresholds[2], vbp_thresholds[3],
                            vbp_thresholds[4] };

  const int segment_id = xd->mi[0]->segment_id;
  uint64_t blk_sad = 0;
  if (cpi->src_sad_blk_64x64 != NULL &&
      cpi->svc.spatial_layer_id == cpi->svc.number_spatial_layers - 1) {
    const int sb_size_by_mb = (cm->seq_params->sb_size == BLOCK_128X128)
                                  ? (cm->seq_params->mib_size >> 1)
                                  : cm->seq_params->mib_size;
    const int sb_cols =
        (cm->mi_params.mi_cols + sb_size_by_mb - 1) / sb_size_by_mb;
    const int sbi_col = mi_col / sb_size_by_mb;
    const int sbi_row = mi_row / sb_size_by_mb;
    blk_sad = cpi->src_sad_blk_64x64[sbi_col + sbi_row * sb_cols];
  }

  const bool is_segment_id_boosted =
      cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ && cm->seg.enabled &&
      cyclic_refresh_segment_id_boosted(segment_id);
  const int qindex =
      is_segment_id_boosted
          ? av1_get_qindex(&cm->seg, segment_id, cm->quant_params.base_qindex)
          : cm->quant_params.base_qindex;
  set_vbp_thresholds(
      cpi, thresholds, blk_sad, qindex, x->content_state_sb.low_sumdiff,
      x->content_state_sb.source_sad_nonrd, x->content_state_sb.source_sad_rd,
      is_segment_id_boosted, x->content_state_sb.lighting_change);

  src_buf = x->plane[AOM_PLANE_Y].src.buf;
  int src_stride = x->plane[AOM_PLANE_Y].src.stride;

  // Index for force_split: 0 for 64x64, 1-4 for 32x32 blocks,
  // 5-20 for the 16x16 blocks.
  force_split[0] = PART_EVAL_ALL;
  memset(x->part_search_info.variance_low, 0,
         sizeof(x->part_search_info.variance_low));

  // Check if LAST frame is NULL, and if so, treat this frame
  // as a key frame, for the purpose of the superblock partitioning.
  // LAST == NULL can happen in cases where enhancement spatial layers are
  // enabled dyanmically and the only reference is the spatial(GOLDEN).
  // If LAST frame has a different resolution: set the scaled_ref_last flag
  // and check if ref_scaled is NULL.
  if (!frame_is_intra_only(cm)) {
    const YV12_BUFFER_CONFIG *ref = get_ref_frame_yv12_buf(cm, LAST_FRAME);
    if (ref == NULL) {
      is_key_frame = true;
    } else if (ref->y_crop_height != cm->height ||
               ref->y_crop_width != cm->width) {
      scaled_ref_last = true;
      const YV12_BUFFER_CONFIG *ref_scaled =
          av1_get_scaled_ref_frame(cpi, LAST_FRAME);
      if (ref_scaled == NULL) is_key_frame = true;
    }
  }

  x->source_variance = UINT_MAX;
  // For nord_pickmode: compute source_variance, only for superblocks with
  // some motion for now. This input can then be used to bias the partitioning
  // or the chroma_check.
  if (cpi->sf.rt_sf.use_nonrd_pick_mode &&
      x->content_state_sb.source_sad_nonrd > kLowSad)
    x->source_variance = av1_get_perpixel_variance_facade(
        cpi, xd, &x->plane[0].src, cm->seq_params->sb_size, AOM_PLANE_Y);

  if (!is_key_frame) {
    setup_planes(cpi, x, &y_sad, &y_sad_g, &y_sad_alt, &y_sad_last,
                 &ref_frame_partition, &sf_no_scale, mi_row, mi_col,
                 is_small_sb, scaled_ref_last);

    MB_MODE_INFO *mi = xd->mi[0];
    // Use reference SB directly for zero mv.
    if (mi->mv[0].as_int != 0) {
      dst_buf = xd->plane[AOM_PLANE_Y].dst.buf;
      dst_stride = xd->plane[AOM_PLANE_Y].dst.stride;
      is_zero_motion = false;
    } else {
      dst_buf = xd->plane[AOM_PLANE_Y].pre[0].buf;
      dst_stride = xd->plane[AOM_PLANE_Y].pre[0].stride;
    }
  } else {
    dst_buf = NULL;
    dst_stride = 0;
  }

  // check and set the color sensitivity of sb.
  av1_zero(uv_sad);
  chroma_check(cpi, x, bsize, y_sad_last, y_sad_g, y_sad_alt, is_key_frame,
               is_zero_motion, uv_sad);

  x->force_zeromv_skip_for_sb = 0;

  VP128x128 *vt;
  AOM_CHECK_MEM_ERROR(xd->error_info, vt, aom_malloc(sizeof(*vt)));
  vt->split = td->vt64x64;

  // If the superblock is completely static (zero source sad) and
  // the y_sad (relative to LAST ref) is very small, take the sb_size partition
  // and exit, and force zeromv_last skip mode for nonrd_pickmode.
  // Only do this on the base segment (so the QP-boosted segment, if applied,
  // can still continue cleaning/ramping up the quality).
  // Condition on color uv_sad is also added.
  if (!is_key_frame && cpi->sf.rt_sf.part_early_exit_zeromv &&
      cpi->rc.frames_since_key > 30 && segment_id == CR_SEGMENT_ID_BASE &&
      ref_frame_partition == LAST_FRAME && xd->mi[0]->mv[0].as_int == 0) {
    // Exit here, if zero mv skip flag is set at SB level.
    if (set_force_zeromv_skip_for_sb(cpi, x, tile, vt, uv_sad, mi_row, mi_col,
                                     y_sad, bsize))
      return 0;
  }

  if (cpi->noise_estimate.enabled)
    noise_level = av1_noise_estimate_extract_level(&cpi->noise_estimate);

  // Fill in the entire tree of 8x8 (for inter frames) or 4x4 (for key frames)
  // variances for splits.
  fill_variance_tree_leaves(cpi, x, vt, force_split, avg_16x16, maxvar_16x16,
                            minvar_16x16, thresholds, src_buf, src_stride,
                            dst_buf, dst_stride, is_key_frame, is_small_sb);

  avg_64x64 = 0;
  for (int blk64_idx = 0; blk64_idx < num_64x64_blocks; ++blk64_idx) {
    max_var_32x32[blk64_idx] = 0;
    min_var_32x32[blk64_idx] = INT_MAX;
    const int blk64_scale_idx = blk64_idx << 2;
    for (int lvl1_idx = 0; lvl1_idx < 4; lvl1_idx++) {
      const int lvl1_scale_idx = (blk64_scale_idx + lvl1_idx) << 2;
      for (int lvl2_idx = 0; lvl2_idx < 4; lvl2_idx++) {
        if (!is_key_frame) continue;
        VP16x16 *vtemp = &vt->split[blk64_idx].split[lvl1_idx].split[lvl2_idx];
        for (int lvl3_idx = 0; lvl3_idx < 4; lvl3_idx++)
          fill_variance_tree(&vtemp->split[lvl3_idx], BLOCK_8X8);
        fill_variance_tree(vtemp, BLOCK_16X16);
        // If variance of this 16x16 block is above the threshold, force block
        // to split. This also forces a split on the upper levels.
        get_variance(&vtemp->part_variances.none);
        if (vtemp->part_variances.none.variance > thresholds[3]) {
          const int split_index = 21 + lvl1_scale_idx + lvl2_idx;
          force_split[split_index] =
              cpi->sf.rt_sf.vbp_prune_16x16_split_using_min_max_sub_blk_var
                  ? get_part_eval_based_on_sub_blk_var(vtemp, thresholds[3])
                  : PART_EVAL_ONLY_SPLIT;
          force_split[5 + blk64_scale_idx + lvl1_idx] = PART_EVAL_ONLY_SPLIT;
          force_split[blk64_idx + 1] = PART_EVAL_ONLY_SPLIT;
          force_split[0] = PART_EVAL_ONLY_SPLIT;
        }
      }
      fill_variance_tree(&vt->split[blk64_idx].split[lvl1_idx], BLOCK_32X32);
      // If variance of this 32x32 block is above the threshold, or if its above
      // (some threshold of) the average variance over the sub-16x16 blocks,
      // then force this block to split. This also forces a split on the upper
      // (64x64) level.
      uint64_t frame_sad_thresh = 20000;
      const int is_360p_or_smaller = cm->width * cm->height <= RESOLUTION_360P;
      if (cpi->svc.number_temporal_layers > 2 &&
          cpi->svc.temporal_layer_id == 0)
        frame_sad_thresh = frame_sad_thresh << 1;
      if (force_split[5 + blk64_scale_idx + lvl1_idx] == PART_EVAL_ALL) {
        get_variance(&vt->split[blk64_idx].split[lvl1_idx].part_variances.none);
        var_32x32 =
            vt->split[blk64_idx].split[lvl1_idx].part_variances.none.variance;
        max_var_32x32[blk64_idx] = AOMMAX(var_32x32, max_var_32x32[blk64_idx]);
        min_var_32x32[blk64_idx] = AOMMIN(var_32x32, min_var_32x32[blk64_idx]);
        const int max_min_var_16X16_diff = (maxvar_16x16[blk64_idx][lvl1_idx] -
                                            minvar_16x16[blk64_idx][lvl1_idx]);

        if (var_32x32 > thresholds[2] ||
            (!is_key_frame && var_32x32 > (thresholds[2] >> 1) &&
             var_32x32 > (avg_16x16[blk64_idx][lvl1_idx] >> 1))) {
          force_split[5 + blk64_scale_idx + lvl1_idx] = PART_EVAL_ONLY_SPLIT;
          force_split[blk64_idx + 1] = PART_EVAL_ONLY_SPLIT;
          force_split[0] = PART_EVAL_ONLY_SPLIT;
        } else if (!is_key_frame && is_360p_or_smaller &&
                   ((max_min_var_16X16_diff > (thresholds[2] >> 1) &&
                     maxvar_16x16[blk64_idx][lvl1_idx] > thresholds[2]) ||
                    (cpi->sf.rt_sf.prefer_large_partition_blocks &&
                     x->content_state_sb.source_sad_nonrd > kLowSad &&
                     cpi->rc.frame_source_sad < frame_sad_thresh &&
                     maxvar_16x16[blk64_idx][lvl1_idx] > (thresholds[2] >> 4) &&
                     maxvar_16x16[blk64_idx][lvl1_idx] >
                         (minvar_16x16[blk64_idx][lvl1_idx] << 2)))) {
          force_split[5 + blk64_scale_idx + lvl1_idx] = PART_EVAL_ONLY_SPLIT;
          force_split[blk64_idx + 1] = PART_EVAL_ONLY_SPLIT;
          force_split[0] = PART_EVAL_ONLY_SPLIT;
        }
      }
    }
    if (force_split[1 + blk64_idx] == PART_EVAL_ALL) {
      fill_variance_tree(&vt->split[blk64_idx], BLOCK_64X64);
      get_variance(&vt->split[blk64_idx].part_variances.none);
      var_64x64 = vt->split[blk64_idx].part_variances.none.variance;
      max_var_64x64 = AOMMAX(var_64x64, max_var_64x64);
      min_var_64x64 = AOMMIN(var_64x64, min_var_64x64);
      // If the difference of the max-min variances of sub-blocks or max
      // variance of a sub-block is above some threshold of then force this
      // block to split. Only checking this for noise level >= medium, if
      // encoder is in SVC or if we already forced large blocks.
      const int max_min_var_32x32_diff =
          max_var_32x32[blk64_idx] - min_var_32x32[blk64_idx];
      const int check_max_var = max_var_32x32[blk64_idx] > thresholds[1] >> 1;
      const bool check_noise_lvl = noise_level >= kMedium ||
                                   cpi->ppi->use_svc ||
                                   cpi->sf.rt_sf.prefer_large_partition_blocks;
      const int64_t set_threshold = 3 * (thresholds[1] >> 3);

      if (!is_key_frame && max_min_var_32x32_diff > set_threshold &&
          check_max_var && check_noise_lvl) {
        force_split[1 + blk64_idx] = PART_EVAL_ONLY_SPLIT;
        force_split[0] = PART_EVAL_ONLY_SPLIT;
      }
      avg_64x64 += var_64x64;
    }
    if (is_small_sb) force_split[0] = PART_EVAL_ONLY_SPLIT;
  }

  if (force_split[0] == PART_EVAL_ALL) {
    fill_variance_tree(vt, BLOCK_128X128);
    get_variance(&vt->part_variances.none);
    const int set_avg_64x64 = (9 * avg_64x64) >> 5;
    if (!is_key_frame && vt->part_variances.none.variance > set_avg_64x64)
      force_split[0] = PART_EVAL_ONLY_SPLIT;

    if (!is_key_frame &&
        (max_var_64x64 - min_var_64x64) > 3 * (thresholds[0] >> 3) &&
        max_var_64x64 > thresholds[0] >> 1)
      force_split[0] = PART_EVAL_ONLY_SPLIT;
  }

  if (mi_col + 32 > tile->mi_col_end || mi_row + 32 > tile->mi_row_end ||
      !set_vt_partitioning(cpi, xd, tile, vt, BLOCK_128X128, mi_row, mi_col,
                           thresholds[0], BLOCK_16X16, force_split[0])) {
    for (int blk64_idx = 0; blk64_idx < num_64x64_blocks; ++blk64_idx) {
      const int x64_idx = GET_BLK_IDX_X(blk64_idx, 4);
      const int y64_idx = GET_BLK_IDX_Y(blk64_idx, 4);
      const int blk64_scale_idx = blk64_idx << 2;

      // Now go through the entire structure, splitting every block size until
      // we get to one that's got a variance lower than our threshold.
      if (set_vt_partitioning(cpi, xd, tile, &vt->split[blk64_idx], BLOCK_64X64,
                              mi_row + y64_idx, mi_col + x64_idx, thresholds[1],
                              BLOCK_16X16, force_split[1 + blk64_idx]))
        continue;
      for (int lvl1_idx = 0; lvl1_idx < 4; ++lvl1_idx) {
        const int x32_idx = GET_BLK_IDX_X(lvl1_idx, 3);
        const int y32_idx = GET_BLK_IDX_Y(lvl1_idx, 3);
        const int lvl1_scale_idx = (blk64_scale_idx + lvl1_idx) << 2;
        if (set_vt_partitioning(
                cpi, xd, tile, &vt->split[blk64_idx].split[lvl1_idx],
                BLOCK_32X32, (mi_row + y64_idx + y32_idx),
                (mi_col + x64_idx + x32_idx), thresholds[2], BLOCK_16X16,
                force_split[5 + blk64_scale_idx + lvl1_idx]))
          continue;
        for (int lvl2_idx = 0; lvl2_idx < 4; ++lvl2_idx) {
          const int x16_idx = GET_BLK_IDX_X(lvl2_idx, 2);
          const int y16_idx = GET_BLK_IDX_Y(lvl2_idx, 2);
          const int split_index = 21 + lvl1_scale_idx + lvl2_idx;
          VP16x16 *vtemp =
              &vt->split[blk64_idx].split[lvl1_idx].split[lvl2_idx];
          if (set_vt_partitioning(cpi, xd, tile, vtemp, BLOCK_16X16,
                                  mi_row + y64_idx + y32_idx + y16_idx,
                                  mi_col + x64_idx + x32_idx + x16_idx,
                                  thresholds[3], BLOCK_8X8,
                                  force_split[split_index]))
            continue;
          for (int lvl3_idx = 0; lvl3_idx < 4; ++lvl3_idx) {
            const int x8_idx = GET_BLK_IDX_X(lvl3_idx, 1);
            const int y8_idx = GET_BLK_IDX_Y(lvl3_idx, 1);
            set_block_size(cpi, (mi_row + y64_idx + y32_idx + y16_idx + y8_idx),
                           (mi_col + x64_idx + x32_idx + x16_idx + x8_idx),
                           BLOCK_8X8);
          }
        }
      }
    }
  }

  if (cpi->sf.rt_sf.short_circuit_low_temp_var) {
    set_low_temp_var_flag(cpi, &x->part_search_info, xd, vt, thresholds,
                          ref_frame_partition, mi_col, mi_row, is_small_sb);
  }

  aom_free(vt);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, choose_var_based_partitioning_time);
#endif
  return 0;
}